

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined4 uVar1;
  Primitive PVar2;
  int iVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  byte bVar47;
  ulong uVar48;
  byte bVar49;
  byte bVar50;
  ulong uVar51;
  byte bVar52;
  byte bVar53;
  uint uVar54;
  byte bVar55;
  byte bVar56;
  long lVar57;
  bool bVar58;
  bool bVar59;
  ulong uVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar135;
  uint uVar136;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  uint uVar137;
  uint uVar141;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar74 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar134 [64];
  float fVar142;
  float fVar164;
  vint4 bi_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  vint4 ai_2;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  vint4 bi;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  vint4 ai;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar225;
  float fVar231;
  float fVar232;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar230 [32];
  float fVar237;
  vint4 ai_1;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  float fVar244;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  float t;
  float fVar248;
  float fVar249;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar250 [64];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  float s;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_bf0;
  RTCFilterFunctionNArguments local_9d0;
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  float local_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [64];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte local_1a0 [32];
  undefined1 auStack_180 [32];
  float local_160 [2];
  int local_158 [74];
  undefined1 auVar123 [32];
  undefined1 auVar133 [64];
  undefined1 auVar116 [32];
  
  PVar2 = prim[1];
  uVar48 = (ulong)(byte)PVar2;
  fVar225 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar68 = vsubps_avx(auVar68,*(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar201._0_4_ = fVar225 * auVar68._0_4_;
  auVar201._4_4_ = fVar225 * auVar68._4_4_;
  auVar201._8_4_ = fVar225 * auVar68._8_4_;
  auVar201._12_4_ = fVar225 * auVar68._12_4_;
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar74._0_4_ = fVar225 * auVar66._0_4_;
  auVar74._4_4_ = fVar225 * auVar66._4_4_;
  auVar74._8_4_ = fVar225 * auVar66._8_4_;
  auVar74._12_4_ = fVar225 * auVar66._12_4_;
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar48 + 6)));
  uVar60 = (ulong)(uint)((int)(uVar48 * 9) * 2);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar240 = vcvtdq2ps_avx(auVar240);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 + uVar48 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar61 = (ulong)(uint)((int)(uVar48 * 5) << 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar259._4_4_ = auVar74._0_4_;
  auVar259._0_4_ = auVar74._0_4_;
  auVar259._8_4_ = auVar74._0_4_;
  auVar259._12_4_ = auVar74._0_4_;
  auVar70 = vshufps_avx(auVar74,auVar74,0x55);
  auVar71 = vshufps_avx(auVar74,auVar74,0xaa);
  fVar225 = auVar71._0_4_;
  auVar215._0_4_ = fVar225 * auVar63._0_4_;
  fVar164 = auVar71._4_4_;
  auVar215._4_4_ = fVar164 * auVar63._4_4_;
  fVar231 = auVar71._8_4_;
  auVar215._8_4_ = fVar231 * auVar63._8_4_;
  fVar232 = auVar71._12_4_;
  auVar215._12_4_ = fVar232 * auVar63._12_4_;
  auVar165._0_4_ = auVar64._0_4_ * fVar225;
  auVar165._4_4_ = auVar64._4_4_ * fVar164;
  auVar165._8_4_ = auVar64._8_4_ * fVar231;
  auVar165._12_4_ = auVar64._12_4_ * fVar232;
  auVar143._0_4_ = auVar65._0_4_ * fVar225;
  auVar143._4_4_ = auVar65._4_4_ * fVar164;
  auVar143._8_4_ = auVar65._8_4_ * fVar231;
  auVar143._12_4_ = auVar65._12_4_ * fVar232;
  auVar71 = vfmadd231ps_fma(auVar215,auVar70,auVar66);
  auVar72 = vfmadd231ps_fma(auVar165,auVar70,auVar75);
  auVar70 = vfmadd231ps_fma(auVar143,auVar69,auVar70);
  auVar73 = vfmadd231ps_fma(auVar71,auVar259,auVar68);
  auVar72 = vfmadd231ps_fma(auVar72,auVar259,auVar67);
  auVar74 = vfmadd231ps_fma(auVar70,auVar240,auVar259);
  auVar260._4_4_ = auVar201._0_4_;
  auVar260._0_4_ = auVar201._0_4_;
  auVar260._8_4_ = auVar201._0_4_;
  auVar260._12_4_ = auVar201._0_4_;
  auVar70 = vshufps_avx(auVar201,auVar201,0x55);
  auVar71 = vshufps_avx(auVar201,auVar201,0xaa);
  auVar63 = vmulps_avx512vl(auVar71,auVar63);
  auVar202._0_4_ = auVar71._0_4_ * auVar64._0_4_;
  auVar202._4_4_ = auVar71._4_4_ * auVar64._4_4_;
  auVar202._8_4_ = auVar71._8_4_ * auVar64._8_4_;
  auVar202._12_4_ = auVar71._12_4_ * auVar64._12_4_;
  auVar185._0_4_ = auVar71._0_4_ * auVar65._0_4_;
  auVar185._4_4_ = auVar71._4_4_ * auVar65._4_4_;
  auVar185._8_4_ = auVar71._8_4_ * auVar65._8_4_;
  auVar185._12_4_ = auVar71._12_4_ * auVar65._12_4_;
  auVar64 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar66);
  auVar66 = vfmadd231ps_fma(auVar202,auVar70,auVar75);
  auVar63 = vfmadd231ps_fma(auVar185,auVar70,auVar69);
  auVar65 = vfmadd231ps_avx512vl(auVar64,auVar260,auVar68);
  auVar64 = vfmadd231ps_fma(auVar66,auVar260,auVar67);
  auVar69 = vfmadd231ps_fma(auVar63,auVar260,auVar240);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar68 = vandps_avx(auVar73,auVar238);
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar68,auVar226,1);
  bVar59 = (bool)((byte)uVar60 & 1);
  auVar71._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar73._0_4_;
  bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar73._4_4_;
  bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar73._8_4_;
  bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar73._12_4_;
  auVar68 = vandps_avx(auVar72,auVar238);
  uVar60 = vcmpps_avx512vl(auVar68,auVar226,1);
  bVar59 = (bool)((byte)uVar60 & 1);
  auVar73._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar72._0_4_;
  bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar72._4_4_;
  bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar72._8_4_;
  bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar72._12_4_;
  auVar68 = vandps_avx(auVar74,auVar238);
  uVar60 = vcmpps_avx512vl(auVar68,auVar226,1);
  bVar59 = (bool)((byte)uVar60 & 1);
  auVar72._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._0_4_;
  bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._4_4_;
  bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._8_4_;
  bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._12_4_;
  auVar66 = vrcp14ps_avx512vl(auVar71);
  auVar227._8_4_ = 0x3f800000;
  auVar227._0_8_ = &DAT_3f8000003f800000;
  auVar227._12_4_ = 0x3f800000;
  auVar68 = vfnmadd213ps_fma(auVar71,auVar66,auVar227);
  auVar63 = vfmadd132ps_fma(auVar68,auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar73);
  auVar68 = vfnmadd213ps_fma(auVar73,auVar66,auVar227);
  auVar75 = vfmadd132ps_fma(auVar68,auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar72);
  auVar68 = vfnmadd213ps_fma(auVar72,auVar66,auVar227);
  auVar240 = vfmadd132ps_fma(auVar68,auVar66,auVar66);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar68 = vpmovsxwd_avx(auVar68);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar67 = vsubps_avx512vl(auVar68,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar68 = vpmovsxwd_avx(auVar66);
  auVar223._0_4_ = auVar63._0_4_ * auVar67._0_4_;
  auVar223._4_4_ = auVar63._4_4_ * auVar67._4_4_;
  auVar223._8_4_ = auVar63._8_4_ * auVar67._8_4_;
  auVar223._12_4_ = auVar63._12_4_ * auVar67._12_4_;
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx512vl(auVar68,auVar65);
  auVar216._0_4_ = auVar63._0_4_ * auVar68._0_4_;
  auVar216._4_4_ = auVar63._4_4_ * auVar68._4_4_;
  auVar216._8_4_ = auVar63._8_4_ * auVar68._8_4_;
  auVar216._12_4_ = auVar63._12_4_ * auVar68._12_4_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar66 = vpmovsxwd_avx(auVar63);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar48 * -2 + 6);
  auVar68 = vpmovsxwd_avx(auVar67);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar64);
  auVar239._0_4_ = auVar75._0_4_ * auVar68._0_4_;
  auVar239._4_4_ = auVar75._4_4_ * auVar68._4_4_;
  auVar239._8_4_ = auVar75._8_4_ * auVar68._8_4_;
  auVar239._12_4_ = auVar75._12_4_ * auVar68._12_4_;
  auVar68 = vcvtdq2ps_avx(auVar66);
  auVar68 = vsubps_avx(auVar68,auVar64);
  auVar166._0_4_ = auVar75._0_4_ * auVar68._0_4_;
  auVar166._4_4_ = auVar75._4_4_ * auVar68._4_4_;
  auVar166._8_4_ = auVar75._8_4_ * auVar68._8_4_;
  auVar166._12_4_ = auVar75._12_4_ * auVar68._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar61 + uVar48 + 6);
  auVar68 = vpmovsxwd_avx(auVar75);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar203._0_4_ = auVar240._0_4_ * auVar68._0_4_;
  auVar203._4_4_ = auVar240._4_4_ * auVar68._4_4_;
  auVar203._8_4_ = auVar240._8_4_ * auVar68._8_4_;
  auVar203._12_4_ = auVar240._12_4_ * auVar68._12_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar68 = vpmovsxwd_avx(auVar64);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar144._0_4_ = auVar240._0_4_ * auVar68._0_4_;
  auVar144._4_4_ = auVar240._4_4_ * auVar68._4_4_;
  auVar144._8_4_ = auVar240._8_4_ * auVar68._8_4_;
  auVar144._12_4_ = auVar240._12_4_ * auVar68._12_4_;
  auVar68 = vpminsd_avx(auVar223,auVar216);
  auVar66 = vpminsd_avx(auVar239,auVar166);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar66 = vpminsd_avx(auVar203,auVar144);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar240._4_4_ = uVar1;
  auVar240._0_4_ = uVar1;
  auVar240._8_4_ = uVar1;
  auVar240._12_4_ = uVar1;
  auVar66 = vmaxps_avx512vl(auVar66,auVar240);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar69._8_4_ = 0x3f7ffffa;
  auVar69._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar69._12_4_ = 0x3f7ffffa;
  local_6d0 = vmulps_avx512vl(auVar68,auVar69);
  auVar68 = vpmaxsd_avx(auVar223,auVar216);
  auVar66 = vpmaxsd_avx(auVar239,auVar166);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar66 = vpmaxsd_avx(auVar203,auVar144);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar66 = vminps_avx512vl(auVar66,auVar65);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar70._8_4_ = 0x3f800003;
  auVar70._0_8_ = 0x3f8000033f800003;
  auVar70._12_4_ = 0x3f800003;
  auVar68 = vmulps_avx512vl(auVar68,auVar70);
  auVar66 = vpbroadcastd_avx512vl();
  uVar13 = vcmpps_avx512vl(local_6d0,auVar68,2);
  uVar60 = vpcmpgtd_avx512vl(auVar66,_DAT_01ff0cf0);
  uVar60 = ((byte)uVar13 & 0xf) & uVar60;
  bVar58 = (char)uVar60 == '\0';
  bVar59 = !bVar58;
  if (bVar58) {
    return bVar59;
  }
  auVar163 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar163);
LAB_01b5b05e:
  lVar57 = 0;
  for (uVar48 = uVar60; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  uVar54 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar54].ptr;
  uVar48 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar57 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar57 = *(long *)&pGVar4[1].time_range.upper;
  auVar68 = *(undefined1 (*) [16])(lVar57 + (long)p_Var5 * uVar48);
  auVar66 = *(undefined1 (*) [16])(lVar57 + (uVar48 + 1) * (long)p_Var5);
  uVar60 = uVar60 - 1 & uVar60;
  if (uVar60 != 0) {
    uVar51 = uVar60 - 1 & uVar60;
    for (uVar61 = uVar60; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    }
    if (uVar51 != 0) {
      for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar67 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar129._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar261._4_4_ = uVar1;
  auVar261._0_4_ = uVar1;
  auVar261._8_4_ = uVar1;
  auVar261._12_4_ = uVar1;
  local_800._16_4_ = uVar1;
  local_800._0_16_ = auVar261;
  local_800._20_4_ = uVar1;
  local_800._24_4_ = uVar1;
  local_800._28_4_ = uVar1;
  auVar63 = vunpcklps_avx512vl(auVar129._0_16_,auVar261);
  fVar225 = *(float *)(ray + k * 4 + 0x180);
  auVar258._4_4_ = fVar225;
  auVar258._0_4_ = fVar225;
  auVar258._8_4_ = fVar225;
  auVar258._12_4_ = fVar225;
  local_680._16_4_ = fVar225;
  local_680._0_16_ = auVar258;
  local_680._20_4_ = fVar225;
  local_680._24_4_ = fVar225;
  local_680._28_4_ = fVar225;
  local_970 = vinsertps_avx(auVar63,auVar258,0x28);
  auVar250 = ZEXT1664(local_970);
  auVar224._0_4_ = auVar68._0_4_ + auVar66._0_4_;
  auVar224._4_4_ = auVar68._4_4_ + auVar66._4_4_;
  auVar224._8_4_ = auVar68._8_4_ + auVar66._8_4_;
  auVar224._12_4_ = auVar68._12_4_ + auVar66._12_4_;
  auVar17._8_4_ = 0x3f000000;
  auVar17._0_8_ = 0x3f0000003f000000;
  auVar17._12_4_ = 0x3f000000;
  auVar63 = vmulps_avx512vl(auVar224,auVar17);
  auVar63 = vsubps_avx(auVar63,auVar67);
  auVar63 = vdpps_avx(auVar63,local_970,0x7f);
  fVar164 = *(float *)(ray + k * 4 + 0xc0);
  local_980 = vdpps_avx(local_970,local_970,0x7f);
  auVar257 = ZEXT1664(local_980);
  auVar228._4_12_ = ZEXT812(0) << 0x20;
  auVar228._0_4_ = local_980._0_4_;
  auVar64 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar228);
  auVar75 = vfnmadd213ss_fma(auVar64,local_980,ZEXT416(0x40000000));
  local_5a0 = auVar63._0_4_ * auVar64._0_4_ * auVar75._0_4_;
  auVar229._4_4_ = local_5a0;
  auVar229._0_4_ = local_5a0;
  auVar229._8_4_ = local_5a0;
  auVar229._12_4_ = local_5a0;
  fStack_7d0 = local_5a0;
  _local_7e0 = auVar229;
  fStack_7cc = local_5a0;
  fStack_7c8 = local_5a0;
  fStack_7c4 = local_5a0;
  auVar63 = vfmadd231ps_fma(auVar67,local_970,auVar229);
  auVar63 = vblendps_avx(auVar63,ZEXT816(0) << 0x40,8);
  auVar68 = vsubps_avx(auVar68,auVar63);
  auVar67 = vsubps_avx(*(undefined1 (*) [16])(lVar57 + (uVar48 + 2) * (long)p_Var5),auVar63);
  auVar66 = vsubps_avx(auVar66,auVar63);
  auVar247 = ZEXT1664(auVar66);
  auVar63 = vsubps_avx(*(undefined1 (*) [16])(lVar57 + (uVar48 + 3) * (long)p_Var5),auVar63);
  auVar76 = vbroadcastss_avx512vl(auVar68);
  auVar86._8_4_ = 1;
  auVar86._0_8_ = 0x100000001;
  auVar86._12_4_ = 1;
  auVar86._16_4_ = 1;
  auVar86._20_4_ = 1;
  auVar86._24_4_ = 1;
  auVar86._28_4_ = 1;
  local_900 = ZEXT1632(auVar68);
  auVar77 = vpermps_avx512vl(auVar86,local_900);
  auVar84._8_4_ = 2;
  auVar84._0_8_ = 0x200000002;
  auVar84._12_4_ = 2;
  auVar84._16_4_ = 2;
  auVar84._20_4_ = 2;
  auVar84._24_4_ = 2;
  auVar84._28_4_ = 2;
  auVar128._0_32_ = vpermps_avx512vl(auVar84,local_900);
  auVar83._8_4_ = 3;
  auVar83._0_8_ = 0x300000003;
  auVar83._12_4_ = 3;
  auVar83._16_4_ = 3;
  auVar83._20_4_ = 3;
  auVar83._24_4_ = 3;
  auVar83._28_4_ = 3;
  auVar78 = vpermps_avx512vl(auVar83,local_900);
  auVar79 = vbroadcastss_avx512vl(auVar66);
  local_940 = ZEXT1632(auVar66);
  local_5c0 = vpermps_avx512vl(auVar86,local_940);
  auVar80 = vpermps_avx512vl(auVar84,local_940);
  auVar81 = vpermps_avx512vl(auVar83,local_940);
  auVar82 = vbroadcastss_avx512vl(auVar67);
  local_920 = ZEXT1632(auVar67);
  local_9a0 = vpermps_avx512vl(auVar86,local_920);
  auVar264 = ZEXT3264(local_9a0);
  auVar127._0_32_ = vpermps_avx512vl(auVar84,local_920);
  local_520 = vpermps_avx2(auVar83,local_920);
  local_5e0 = auVar63._0_4_;
  _local_960 = ZEXT1632(auVar63);
  local_600 = vpermps_avx512vl(auVar86,_local_960);
  _local_540 = vpermps_avx2(auVar84,_local_960);
  local_560 = vpermps_avx2(auVar83,_local_960);
  auVar68 = vfmadd231ps_fma(ZEXT432((uint)(fVar225 * fVar225)),local_800,local_800);
  local_6a0 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar129._0_32_,auVar129._0_32_);
  local_580._0_4_ = local_6a0._0_4_;
  local_580._4_4_ = local_580._0_4_;
  local_580._8_4_ = local_580._0_4_;
  local_580._12_4_ = local_580._0_4_;
  local_580._16_4_ = local_580._0_4_;
  local_580._20_4_ = local_580._0_4_;
  local_580._24_4_ = local_580._0_4_;
  local_580._28_4_ = local_580._0_4_;
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_580,auVar122);
  local_8c0 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar164 - local_5a0;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  auVar163 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar163);
  iVar3 = 1;
  uVar48 = 0;
  bVar55 = 0;
  auVar163 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar163);
  auVar68 = vsqrtss_avx(local_980,local_980);
  auVar66 = vsqrtss_avx(local_980,local_980);
  local_8e0 = ZEXT816(0x3f80000000000000);
  auVar214 = ZEXT3264(_DAT_02020f20);
  auVar200 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar122 = auVar163._32_32_;
  fStack_5dc = local_5e0;
  fStack_5d8 = local_5e0;
  fStack_5d4 = local_5e0;
  fStack_5d0 = local_5e0;
  fStack_5cc = local_5e0;
  fStack_5c8 = local_5e0;
  fStack_5c4 = local_5e0;
  do {
    auVar63 = vmovshdup_avx(local_8e0);
    auVar219._0_4_ = local_8e0._0_4_;
    fVar225 = auVar63._0_4_ - auVar219._0_4_;
    fVar236 = fVar225 * 0.04761905;
    auVar219._4_4_ = auVar219._0_4_;
    auVar219._8_4_ = auVar219._0_4_;
    auVar219._12_4_ = auVar219._0_4_;
    auVar219._16_4_ = auVar219._0_4_;
    auVar219._20_4_ = auVar219._0_4_;
    auVar219._24_4_ = auVar219._0_4_;
    auVar219._28_4_ = auVar219._0_4_;
    auVar153._4_4_ = fVar225;
    auVar153._0_4_ = fVar225;
    auVar153._8_4_ = fVar225;
    auVar153._12_4_ = fVar225;
    auVar153._16_4_ = fVar225;
    auVar153._20_4_ = fVar225;
    auVar153._24_4_ = fVar225;
    auVar153._28_4_ = fVar225;
    auVar63 = vfmadd231ps_fma(auVar219,auVar153,auVar214._0_32_);
    auVar86 = vsubps_avx(auVar200._0_32_,ZEXT1632(auVar63));
    fVar225 = auVar63._0_4_;
    fVar231 = auVar63._4_4_;
    fVar232 = auVar63._8_4_;
    fVar233 = auVar63._12_4_;
    fVar234 = auVar86._0_4_;
    fVar235 = auVar86._4_4_;
    fVar254 = auVar86._8_4_;
    fVar237 = auVar86._12_4_;
    fVar142 = auVar86._16_4_;
    fVar243 = auVar86._20_4_;
    fVar244 = auVar86._24_4_;
    auVar92._4_4_ = fVar235 * fVar235 * -fVar231;
    auVar92._0_4_ = fVar234 * fVar234 * -fVar225;
    auVar92._8_4_ = fVar254 * fVar254 * -fVar232;
    auVar92._12_4_ = fVar237 * fVar237 * -fVar233;
    auVar92._16_4_ = fVar142 * fVar142 * -0.0;
    auVar92._20_4_ = fVar243 * fVar243 * -0.0;
    auVar92._24_4_ = fVar244 * fVar244 * -0.0;
    auVar92._28_4_ = 0x80000000;
    auVar83 = vmulps_avx512vl(ZEXT1632(auVar63),ZEXT1632(auVar63));
    fVar248 = fVar225 * 3.0;
    fVar251 = fVar231 * 3.0;
    fVar252 = fVar232 * 3.0;
    fVar253 = fVar233 * 3.0;
    auVar163._28_36_ = auVar250._28_36_;
    auVar163._0_28_ = ZEXT1628(CONCAT412(fVar253,CONCAT48(fVar252,CONCAT44(fVar251,fVar248))));
    auVar255._0_4_ = fVar248 + -5.0;
    auVar255._4_4_ = fVar251 + -5.0;
    auVar255._8_4_ = fVar252 + -5.0;
    auVar255._12_4_ = fVar253 + -5.0;
    auVar255._16_4_ = 0xc0a00000;
    auVar255._20_4_ = 0xc0a00000;
    auVar255._24_4_ = 0xc0a00000;
    auVar255._28_4_ = auVar250._28_4_ + -5.0;
    auVar84 = vmulps_avx512vl(auVar83,auVar255);
    auVar108._0_4_ = auVar84._0_4_ + 2.0;
    auVar108._4_4_ = auVar84._4_4_ + 2.0;
    auVar108._8_4_ = auVar84._8_4_ + 2.0;
    auVar108._12_4_ = auVar84._12_4_ + 2.0;
    auVar108._16_4_ = auVar84._16_4_ + 2.0;
    auVar108._20_4_ = auVar84._20_4_ + 2.0;
    auVar108._24_4_ = auVar84._24_4_ + 2.0;
    auVar108._28_4_ = auVar84._28_4_ + 2.0;
    auVar200._0_4_ = fVar234 * fVar234;
    auVar200._4_4_ = fVar235 * fVar235;
    auVar200._8_4_ = fVar254 * fVar254;
    auVar200._12_4_ = fVar237 * fVar237;
    auVar200._16_4_ = fVar142 * fVar142;
    auVar200._20_4_ = fVar243 * fVar243;
    auVar200._28_36_ = auVar257._28_36_;
    auVar200._24_4_ = fVar244 * fVar244;
    auVar109._0_4_ = auVar200._0_4_ * (fVar234 * 3.0 + -5.0) + 2.0;
    auVar109._4_4_ = auVar200._4_4_ * (fVar235 * 3.0 + -5.0) + 2.0;
    auVar109._8_4_ = auVar200._8_4_ * (fVar254 * 3.0 + -5.0) + 2.0;
    auVar109._12_4_ = auVar200._12_4_ * (fVar237 * 3.0 + -5.0) + 2.0;
    auVar109._16_4_ = auVar200._16_4_ * (fVar142 * 3.0 + -5.0) + 2.0;
    auVar109._20_4_ = auVar200._20_4_ * (fVar243 * 3.0 + -5.0) + 2.0;
    auVar109._24_4_ = auVar200._24_4_ * (fVar244 * 3.0 + -5.0) + 2.0;
    auVar109._28_4_ = auVar247._28_4_ + -5.0 + 2.0;
    fVar249 = auVar86._28_4_;
    auVar93._4_4_ = fVar231 * fVar231 * -fVar235;
    auVar93._0_4_ = fVar225 * fVar225 * -fVar234;
    auVar93._8_4_ = fVar232 * fVar232 * -fVar254;
    auVar93._12_4_ = fVar233 * fVar233 * -fVar237;
    auVar93._16_4_ = -fVar142 * 0.0 * 0.0;
    auVar93._20_4_ = -fVar243 * 0.0 * 0.0;
    auVar93._24_4_ = -fVar244 * 0.0 * 0.0;
    auVar93._28_4_ = -fVar249;
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar86 = vmulps_avx512vl(auVar92,auVar85);
    auVar84 = vmulps_avx512vl(auVar108,auVar85);
    auVar87 = vmulps_avx512vl(auVar109,auVar85);
    auVar88 = vmulps_avx512vl(auVar93,auVar85);
    auVar94._4_4_ = fStack_5dc * auVar88._4_4_;
    auVar94._0_4_ = local_5e0 * auVar88._0_4_;
    auVar94._8_4_ = fStack_5d8 * auVar88._8_4_;
    auVar94._12_4_ = fStack_5d4 * auVar88._12_4_;
    auVar94._16_4_ = fStack_5d0 * auVar88._16_4_;
    auVar94._20_4_ = fStack_5cc * auVar88._20_4_;
    auVar94._24_4_ = fStack_5c8 * auVar88._24_4_;
    auVar94._28_4_ = 0x80000000;
    auVar89 = vmulps_avx512vl(local_600,auVar88);
    auVar96._4_4_ = (float)local_540._4_4_ * auVar88._4_4_;
    auVar96._0_4_ = (float)local_540._0_4_ * auVar88._0_4_;
    auVar96._8_4_ = fStack_538 * auVar88._8_4_;
    auVar96._12_4_ = fStack_534 * auVar88._12_4_;
    auVar96._16_4_ = fStack_530 * auVar88._16_4_;
    auVar96._20_4_ = fStack_52c * auVar88._20_4_;
    auVar96._24_4_ = fStack_528 * auVar88._24_4_;
    auVar96._28_4_ = auVar108._28_4_;
    auVar88 = vmulps_avx512vl(local_560,auVar88);
    auVar90 = vfmadd231ps_avx512vl(auVar94,auVar87,auVar82);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar264._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar96,auVar87,auVar127._0_32_);
    auVar87 = vfmadd231ps_avx512vl(auVar88,local_520,auVar87);
    auVar88 = vfmadd231ps_avx512vl(auVar90,auVar84,auVar79);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar84,local_5c0);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar84,auVar80);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar81,auVar84);
    auVar92 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar76);
    local_820 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar77);
    auVar93 = vfmadd231ps_avx512vl(auVar90,auVar86,auVar128._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar87,auVar78,auVar86);
    auVar97._4_4_ = (fVar235 + fVar235) * fVar231;
    auVar97._0_4_ = (fVar234 + fVar234) * fVar225;
    auVar97._8_4_ = (fVar254 + fVar254) * fVar232;
    auVar97._12_4_ = (fVar237 + fVar237) * fVar233;
    auVar97._16_4_ = (fVar142 + fVar142) * 0.0;
    auVar97._20_4_ = (fVar243 + fVar243) * 0.0;
    auVar97._24_4_ = (fVar244 + fVar244) * 0.0;
    auVar97._28_4_ = auVar84._28_4_;
    auVar86 = vsubps_avx(auVar97,auVar200._0_32_);
    auVar116._0_28_ =
         ZEXT1628(CONCAT412((fVar233 + fVar233) * auVar255._12_4_ + fVar253 * fVar233,
                            CONCAT48((fVar232 + fVar232) * auVar255._8_4_ + fVar252 * fVar232,
                                     CONCAT44((fVar231 + fVar231) * auVar255._4_4_ +
                                              fVar251 * fVar231,
                                              (fVar225 + fVar225) * auVar255._0_4_ +
                                              fVar248 * fVar225))));
    auVar116._28_4_ = auVar255._28_4_ + 0.0;
    auVar87._8_4_ = 0x40000000;
    auVar87._0_8_ = 0x4000000040000000;
    auVar87._12_4_ = 0x40000000;
    auVar87._16_4_ = 0x40000000;
    auVar87._20_4_ = 0x40000000;
    auVar87._24_4_ = 0x40000000;
    auVar87._28_4_ = 0x40000000;
    auVar84 = vaddps_avx512vl(auVar163._0_32_,auVar87);
    auVar98._4_4_ = (fVar235 + fVar235) * auVar84._4_4_;
    auVar98._0_4_ = (fVar234 + fVar234) * auVar84._0_4_;
    auVar98._8_4_ = (fVar254 + fVar254) * auVar84._8_4_;
    auVar98._12_4_ = (fVar237 + fVar237) * auVar84._12_4_;
    auVar98._16_4_ = (fVar142 + fVar142) * auVar84._16_4_;
    auVar98._20_4_ = (fVar243 + fVar243) * auVar84._20_4_;
    auVar98._24_4_ = (fVar244 + fVar244) * auVar84._24_4_;
    auVar98._28_4_ = auVar84._28_4_;
    auVar99._4_4_ = fVar235 * 3.0 * fVar235;
    auVar99._0_4_ = fVar234 * 3.0 * fVar234;
    auVar99._8_4_ = fVar254 * 3.0 * fVar254;
    auVar99._12_4_ = fVar237 * 3.0 * fVar237;
    auVar99._16_4_ = fVar142 * 3.0 * fVar142;
    auVar99._20_4_ = fVar243 * 3.0 * fVar243;
    auVar99._24_4_ = fVar244 * 3.0 * fVar244;
    auVar99._28_4_ = fVar249;
    auVar84 = vsubps_avx(auVar98,auVar99);
    auVar83 = vsubps_avx512vl(auVar83,auVar97);
    auVar87 = vmulps_avx512vl(auVar86,auVar85);
    auVar89 = vmulps_avx512vl(auVar116,auVar85);
    auVar84 = vmulps_avx512vl(auVar84,auVar85);
    auVar83 = vmulps_avx512vl(auVar83,auVar85);
    fVar225 = auVar83._0_4_;
    fVar231 = auVar83._4_4_;
    auVar101._4_4_ = fStack_5dc * fVar231;
    auVar101._0_4_ = local_5e0 * fVar225;
    fVar232 = auVar83._8_4_;
    auVar101._8_4_ = fStack_5d8 * fVar232;
    fVar233 = auVar83._12_4_;
    auVar101._12_4_ = fStack_5d4 * fVar233;
    fVar234 = auVar83._16_4_;
    auVar101._16_4_ = fStack_5d0 * fVar234;
    fVar235 = auVar83._20_4_;
    auVar101._20_4_ = fStack_5cc * fVar235;
    fVar254 = auVar83._24_4_;
    auVar101._24_4_ = fStack_5c8 * fVar254;
    auVar101._28_4_ = auVar255._28_4_;
    auVar102._4_4_ = fVar231 * local_600._4_4_;
    auVar102._0_4_ = fVar225 * local_600._0_4_;
    auVar102._8_4_ = fVar232 * local_600._8_4_;
    auVar102._12_4_ = fVar233 * local_600._12_4_;
    auVar102._16_4_ = fVar234 * local_600._16_4_;
    auVar102._20_4_ = fVar235 * local_600._20_4_;
    auVar102._24_4_ = fVar254 * local_600._24_4_;
    auVar102._28_4_ = fStack_5c4;
    auVar103._4_4_ = fVar231 * (float)local_540._4_4_;
    auVar103._0_4_ = fVar225 * (float)local_540._0_4_;
    auVar103._8_4_ = fVar232 * fStack_538;
    auVar103._12_4_ = fVar233 * fStack_534;
    auVar103._16_4_ = fVar234 * fStack_530;
    auVar103._20_4_ = fVar235 * fStack_52c;
    auVar103._24_4_ = fVar254 * fStack_528;
    auVar103._28_4_ = fVar249 + fVar249;
    auVar83 = vmulps_avx512vl(local_560,auVar83);
    auVar85 = vfmadd231ps_avx512vl(auVar101,auVar84,auVar82);
    auVar90 = vfmadd231ps_avx512vl(auVar102,auVar84,auVar264._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar103,auVar84,auVar127._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar83,local_520,auVar84);
    auVar83 = vfmadd231ps_avx512vl(auVar85,auVar89,auVar79);
    auVar85 = vfmadd231ps_avx512vl(auVar90,auVar89,local_5c0);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar80);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar81,auVar89);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar76);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar77);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar128._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar78,auVar87);
    auVar112._4_4_ = auVar83._4_4_ * fVar236;
    auVar112._0_4_ = auVar83._0_4_ * fVar236;
    auVar112._8_4_ = auVar83._8_4_ * fVar236;
    auVar112._12_4_ = auVar83._12_4_ * fVar236;
    auVar112._16_4_ = auVar83._16_4_ * fVar236;
    auVar112._20_4_ = auVar83._20_4_ * fVar236;
    auVar112._24_4_ = auVar83._24_4_ * fVar236;
    auVar112._28_4_ = auVar86._28_4_;
    auVar113._4_4_ = auVar85._4_4_ * fVar236;
    auVar113._0_4_ = auVar85._0_4_ * fVar236;
    auVar113._8_4_ = auVar85._8_4_ * fVar236;
    auVar113._12_4_ = auVar85._12_4_ * fVar236;
    auVar113._16_4_ = auVar85._16_4_ * fVar236;
    auVar113._20_4_ = auVar85._20_4_ * fVar236;
    auVar113._24_4_ = auVar85._24_4_ * fVar236;
    auVar113._28_4_ = auVar85._28_4_;
    auVar114._4_4_ = auVar89._4_4_ * fVar236;
    auVar114._0_4_ = auVar89._0_4_ * fVar236;
    auVar114._8_4_ = auVar89._8_4_ * fVar236;
    auVar114._12_4_ = auVar89._12_4_ * fVar236;
    auVar114._16_4_ = auVar89._16_4_ * fVar236;
    auVar114._20_4_ = auVar89._20_4_ * fVar236;
    auVar114._24_4_ = auVar89._24_4_ * fVar236;
    auVar114._28_4_ = auVar89._28_4_;
    fVar225 = auVar84._0_4_ * fVar236;
    fVar231 = auVar84._4_4_ * fVar236;
    auVar104._4_4_ = fVar231;
    auVar104._0_4_ = fVar225;
    fVar232 = auVar84._8_4_ * fVar236;
    auVar104._8_4_ = fVar232;
    fVar233 = auVar84._12_4_ * fVar236;
    auVar104._12_4_ = fVar233;
    fVar234 = auVar84._16_4_ * fVar236;
    auVar104._16_4_ = fVar234;
    fVar235 = auVar84._20_4_ * fVar236;
    auVar104._20_4_ = fVar235;
    fVar236 = auVar84._24_4_ * fVar236;
    auVar104._24_4_ = fVar236;
    auVar104._28_4_ = fStack_524;
    auVar63 = vxorps_avx512vl(auVar82._0_16_,auVar82._0_16_);
    auVar94 = vpermt2ps_avx512vl(auVar92,_DAT_0205fd20,ZEXT1632(auVar63));
    auVar247 = ZEXT3264(auVar94);
    auVar95 = vpermt2ps_avx512vl(local_820,_DAT_0205fd20,ZEXT1632(auVar63));
    auVar83 = ZEXT1632(auVar63);
    auVar96 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar83);
    auVar220._0_4_ = auVar88._0_4_ + fVar225;
    auVar220._4_4_ = auVar88._4_4_ + fVar231;
    auVar220._8_4_ = auVar88._8_4_ + fVar232;
    auVar220._12_4_ = auVar88._12_4_ + fVar233;
    auVar220._16_4_ = auVar88._16_4_ + fVar234;
    auVar220._20_4_ = auVar88._20_4_ + fVar235;
    auVar220._24_4_ = auVar88._24_4_ + fVar236;
    auVar220._28_4_ = auVar88._28_4_ + fStack_524;
    auVar86 = vmaxps_avx(auVar88,auVar220);
    auVar84 = vminps_avx(auVar88,auVar220);
    auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_0205fd20,auVar83);
    auVar97 = vpermt2ps_avx512vl(auVar112,_DAT_0205fd20,auVar83);
    auVar98 = vpermt2ps_avx512vl(auVar113,_DAT_0205fd20,auVar83);
    auVar108 = ZEXT1632(auVar63);
    auVar99 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,auVar108);
    auVar83 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,auVar108);
    auVar89 = vsubps_avx512vl(auVar88,auVar83);
    auVar83 = vsubps_avx(auVar94,auVar92);
    auVar87 = vsubps_avx(auVar95,local_820);
    local_840 = vsubps_avx512vl(auVar96,auVar93);
    auVar85 = vmulps_avx512vl(auVar87,auVar114);
    auVar85 = vfmsub231ps_avx512vl(auVar85,auVar113,local_840);
    auVar90 = vmulps_avx512vl(local_840,auVar112);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar114,auVar83);
    auVar91 = vmulps_avx512vl(auVar83,auVar113);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar112,auVar87);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar90,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,auVar85);
    auVar85 = vmulps_avx512vl(local_840,local_840);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar87);
    auVar91 = vfmadd231ps_avx512vl(auVar85,auVar83,auVar83);
    auVar100 = vrcp14ps_avx512vl(auVar91);
    auVar85._8_4_ = 0x3f800000;
    auVar85._0_8_ = &DAT_3f8000003f800000;
    auVar85._12_4_ = 0x3f800000;
    auVar85._16_4_ = 0x3f800000;
    auVar85._20_4_ = 0x3f800000;
    auVar85._24_4_ = 0x3f800000;
    auVar85._28_4_ = 0x3f800000;
    auVar85 = vfnmadd213ps_avx512vl(auVar100,auVar91,auVar85);
    auVar85 = vfmadd132ps_avx512vl(auVar85,auVar100,auVar100);
    auVar90 = vmulps_avx512vl(auVar90,auVar85);
    auVar100 = vmulps_avx512vl(auVar87,auVar99);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar98,local_840);
    auVar101 = vmulps_avx512vl(local_840,auVar97);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar99,auVar83);
    auVar102 = vmulps_avx512vl(auVar83,auVar98);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar97,auVar87);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar85 = vmulps_avx512vl(auVar100,auVar85);
    auVar85 = vmaxps_avx512vl(auVar90,auVar85);
    auVar85 = vsqrtps_avx512vl(auVar85);
    auVar90 = vmaxps_avx512vl(auVar89,auVar88);
    auVar86 = vmaxps_avx512vl(auVar86,auVar90);
    auVar90 = vaddps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar89,auVar88);
    auVar86 = vminps_avx(auVar84,auVar86);
    auVar86 = vsubps_avx512vl(auVar86,auVar85);
    auVar88._8_4_ = 0x3f800002;
    auVar88._0_8_ = 0x3f8000023f800002;
    auVar88._12_4_ = 0x3f800002;
    auVar88._16_4_ = 0x3f800002;
    auVar88._20_4_ = 0x3f800002;
    auVar88._24_4_ = 0x3f800002;
    auVar88._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar90,auVar88);
    auVar89._8_4_ = 0x3f7ffffc;
    auVar89._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar89._12_4_ = 0x3f7ffffc;
    auVar89._16_4_ = 0x3f7ffffc;
    auVar89._20_4_ = 0x3f7ffffc;
    auVar89._24_4_ = 0x3f7ffffc;
    auVar89._28_4_ = 0x3f7ffffc;
    auVar85 = vmulps_avx512vl(auVar86,auVar89);
    auVar106._4_4_ = auVar84._4_4_ * auVar84._4_4_;
    auVar106._0_4_ = auVar84._0_4_ * auVar84._0_4_;
    auVar106._8_4_ = auVar84._8_4_ * auVar84._8_4_;
    auVar106._12_4_ = auVar84._12_4_ * auVar84._12_4_;
    auVar106._16_4_ = auVar84._16_4_ * auVar84._16_4_;
    auVar106._20_4_ = auVar84._20_4_ * auVar84._20_4_;
    auVar106._24_4_ = auVar84._24_4_ * auVar84._24_4_;
    auVar106._28_4_ = auVar85._28_4_;
    auVar86 = vrsqrt14ps_avx512vl(auVar91);
    auVar90._8_4_ = 0xbf000000;
    auVar90._0_8_ = 0xbf000000bf000000;
    auVar90._12_4_ = 0xbf000000;
    auVar90._16_4_ = 0xbf000000;
    auVar90._20_4_ = 0xbf000000;
    auVar90._24_4_ = 0xbf000000;
    auVar90._28_4_ = 0xbf000000;
    auVar84 = vmulps_avx512vl(auVar91,auVar90);
    auVar105._4_4_ = auVar86._4_4_ * auVar84._4_4_;
    auVar105._0_4_ = auVar86._0_4_ * auVar84._0_4_;
    auVar105._8_4_ = auVar86._8_4_ * auVar84._8_4_;
    auVar105._12_4_ = auVar86._12_4_ * auVar84._12_4_;
    auVar105._16_4_ = auVar86._16_4_ * auVar84._16_4_;
    auVar105._20_4_ = auVar86._20_4_ * auVar84._20_4_;
    auVar105._24_4_ = auVar86._24_4_ * auVar84._24_4_;
    auVar105._28_4_ = auVar84._28_4_;
    auVar84 = vmulps_avx512vl(auVar86,auVar86);
    auVar84 = vmulps_avx512vl(auVar84,auVar105);
    auVar91._8_4_ = 0x3fc00000;
    auVar91._0_8_ = 0x3fc000003fc00000;
    auVar91._12_4_ = 0x3fc00000;
    auVar91._16_4_ = 0x3fc00000;
    auVar91._20_4_ = 0x3fc00000;
    auVar91._24_4_ = 0x3fc00000;
    auVar91._28_4_ = 0x3fc00000;
    auVar88 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar91);
    auVar107._4_4_ = auVar88._4_4_ * auVar83._4_4_;
    auVar107._0_4_ = auVar88._0_4_ * auVar83._0_4_;
    auVar107._8_4_ = auVar88._8_4_ * auVar83._8_4_;
    auVar107._12_4_ = auVar88._12_4_ * auVar83._12_4_;
    auVar107._16_4_ = auVar88._16_4_ * auVar83._16_4_;
    auVar107._20_4_ = auVar88._20_4_ * auVar83._20_4_;
    auVar107._24_4_ = auVar88._24_4_ * auVar83._24_4_;
    auVar107._28_4_ = auVar86._28_4_;
    auVar86 = vmulps_avx512vl(auVar87,auVar88);
    auVar84 = vmulps_avx512vl(local_840,auVar88);
    auVar89 = vsubps_avx512vl(auVar108,auVar92);
    auVar90 = vsubps_avx512vl(auVar108,local_820);
    auVar91 = vsubps_avx512vl(auVar108,auVar93);
    auVar100 = vmulps_avx512vl(local_680,auVar91);
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_800,auVar90);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar129._0_32_,auVar89);
    auVar101 = vmulps_avx512vl(auVar91,auVar91);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar90);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar89);
    auVar102 = vmulps_avx512vl(local_680,auVar84);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar86,local_800);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,auVar129._0_32_);
    auVar84 = vmulps_avx512vl(auVar91,auVar84);
    auVar86 = vfmadd231ps_avx512vl(auVar84,auVar90,auVar86);
    auVar103 = vfmadd231ps_avx512vl(auVar86,auVar89,auVar107);
    auVar104 = vmulps_avx512vl(auVar102,auVar102);
    auVar86 = vsubps_avx(local_580,auVar104);
    auVar84 = vmulps_avx512vl(auVar102,auVar103);
    auVar84 = vsubps_avx512vl(auVar100,auVar84);
    auVar105 = vaddps_avx512vl(auVar84,auVar84);
    auVar84 = vmulps_avx512vl(auVar103,auVar103);
    auVar101 = vsubps_avx512vl(auVar101,auVar84);
    auVar84 = vsubps_avx(auVar101,auVar106);
    auVar106 = vmulps_avx512vl(auVar105,auVar105);
    auVar100._8_4_ = 0x40800000;
    auVar100._0_8_ = 0x4080000040800000;
    auVar100._12_4_ = 0x40800000;
    auVar100._16_4_ = 0x40800000;
    auVar100._20_4_ = 0x40800000;
    auVar100._24_4_ = 0x40800000;
    auVar100._28_4_ = 0x40800000;
    auVar100 = vmulps_avx512vl(auVar86,auVar100);
    auVar107 = vmulps_avx512vl(auVar100,auVar84);
    auVar107 = vsubps_avx512vl(auVar106,auVar107);
    uVar61 = vcmpps_avx512vl(auVar107,auVar108,5);
    bVar50 = (byte)uVar61;
    if (bVar50 == 0) {
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar107 = vsqrtps_avx512vl(auVar107);
      auVar108 = vaddps_avx512vl(auVar86,auVar86);
      auVar109 = vrcp14ps_avx512vl(auVar108);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = &DAT_3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar23._16_4_ = 0x3f800000;
      auVar23._20_4_ = 0x3f800000;
      auVar23._24_4_ = 0x3f800000;
      auVar23._28_4_ = 0x3f800000;
      auVar108 = vfnmadd213ps_avx512vl(auVar108,auVar109,auVar23);
      auVar108 = vfmadd132ps_avx512vl(auVar108,auVar109,auVar109);
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar24._16_4_ = 0x80000000;
      auVar24._20_4_ = 0x80000000;
      auVar24._24_4_ = 0x80000000;
      auVar24._28_4_ = 0x80000000;
      auVar109 = vxorps_avx512vl(auVar105,auVar24);
      auVar109 = vsubps_avx512vl(auVar109,auVar107);
      auVar109 = vmulps_avx512vl(auVar109,auVar108);
      auVar107 = vsubps_avx512vl(auVar107,auVar105);
      auVar107 = vmulps_avx512vl(auVar107,auVar108);
      auVar108 = vfmadd213ps_avx512vl(auVar102,auVar109,auVar103);
      local_700 = vmulps_avx512vl(auVar88,auVar108);
      auVar108 = vfmadd213ps_avx512vl(auVar102,auVar107,auVar103);
      local_720 = vmulps_avx512vl(auVar88,auVar108);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar108 = vblendmps_avx512vl(auVar108,auVar109);
      auVar110._0_4_ =
           (uint)(bVar50 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar50 & 1) * local_720._0_4_;
      bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar58 * auVar108._4_4_ | (uint)!bVar58 * local_720._4_4_;
      bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar58 * auVar108._8_4_ | (uint)!bVar58 * local_720._8_4_;
      bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar58 * auVar108._12_4_ | (uint)!bVar58 * local_720._12_4_;
      bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar110._16_4_ = (uint)bVar58 * auVar108._16_4_ | (uint)!bVar58 * local_720._16_4_;
      bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar110._20_4_ = (uint)bVar58 * auVar108._20_4_ | (uint)!bVar58 * local_720._20_4_;
      bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar110._24_4_ = (uint)bVar58 * auVar108._24_4_ | (uint)!bVar58 * local_720._24_4_;
      bVar58 = SUB81(uVar61 >> 7,0);
      auVar110._28_4_ = (uint)bVar58 * auVar108._28_4_ | (uint)!bVar58 * local_720._28_4_;
      auVar210._8_4_ = 0xff800000;
      auVar210._0_8_ = 0xff800000ff800000;
      auVar210._12_4_ = 0xff800000;
      auVar210._16_4_ = 0xff800000;
      auVar210._20_4_ = 0xff800000;
      auVar210._24_4_ = 0xff800000;
      auVar210._28_4_ = 0xff800000;
      auVar108 = vblendmps_avx512vl(auVar210,auVar107);
      auVar111._0_4_ =
           (uint)(bVar50 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar107._0_4_;
      bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar58 * auVar108._4_4_ | (uint)!bVar58 * auVar107._4_4_;
      bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar58 * auVar108._8_4_ | (uint)!bVar58 * auVar107._8_4_;
      bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar58 * auVar108._12_4_ | (uint)!bVar58 * auVar107._12_4_;
      bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar58 * auVar108._16_4_ | (uint)!bVar58 * auVar107._16_4_;
      bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar58 * auVar108._20_4_ | (uint)!bVar58 * auVar107._20_4_;
      bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar58 * auVar108._24_4_ | (uint)!bVar58 * auVar107._24_4_;
      bVar58 = SUB81(uVar61 >> 7,0);
      auVar111._28_4_ = (uint)bVar58 * auVar108._28_4_ | (uint)!bVar58 * auVar107._28_4_;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar104);
      auVar108 = vmaxps_avx512vl(local_6a0,auVar107);
      auVar25._8_4_ = 0x36000000;
      auVar25._0_8_ = 0x3600000036000000;
      auVar25._12_4_ = 0x36000000;
      auVar25._16_4_ = 0x36000000;
      auVar25._20_4_ = 0x36000000;
      auVar25._24_4_ = 0x36000000;
      auVar25._28_4_ = 0x36000000;
      auVar108 = vmulps_avx512vl(auVar108,auVar25);
      vandps_avx512vl(auVar86,auVar107);
      uVar51 = vcmpps_avx512vl(auVar108,auVar108,1);
      uVar61 = uVar61 & uVar51;
      bVar53 = (byte)uVar61;
      if (bVar53 != 0) {
        uVar51 = vcmpps_avx512vl(auVar84,_DAT_02020f00,2);
        auVar221._8_4_ = 0xff800000;
        auVar221._0_8_ = 0xff800000ff800000;
        auVar221._12_4_ = 0xff800000;
        auVar221._16_4_ = 0xff800000;
        auVar221._20_4_ = 0xff800000;
        auVar221._24_4_ = 0xff800000;
        auVar221._28_4_ = 0xff800000;
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar107 = vblendmps_avx512vl(auVar84,auVar221);
        bVar49 = (byte)uVar51;
        uVar62 = (uint)(bVar49 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar49 & 1) * auVar108._0_4_;
        bVar58 = (bool)((byte)(uVar51 >> 1) & 1);
        uVar135 = (uint)bVar58 * auVar107._4_4_ | (uint)!bVar58 * auVar108._4_4_;
        bVar58 = (bool)((byte)(uVar51 >> 2) & 1);
        uVar136 = (uint)bVar58 * auVar107._8_4_ | (uint)!bVar58 * auVar108._8_4_;
        bVar58 = (bool)((byte)(uVar51 >> 3) & 1);
        uVar137 = (uint)bVar58 * auVar107._12_4_ | (uint)!bVar58 * auVar108._12_4_;
        bVar58 = (bool)((byte)(uVar51 >> 4) & 1);
        uVar138 = (uint)bVar58 * auVar107._16_4_ | (uint)!bVar58 * auVar108._16_4_;
        bVar58 = (bool)((byte)(uVar51 >> 5) & 1);
        uVar139 = (uint)bVar58 * auVar107._20_4_ | (uint)!bVar58 * auVar108._20_4_;
        bVar58 = (bool)((byte)(uVar51 >> 6) & 1);
        uVar140 = (uint)bVar58 * auVar107._24_4_ | (uint)!bVar58 * auVar108._24_4_;
        bVar58 = SUB81(uVar51 >> 7,0);
        uVar141 = (uint)bVar58 * auVar107._28_4_ | (uint)!bVar58 * auVar108._28_4_;
        auVar110._0_4_ = (bVar53 & 1) * uVar62 | !(bool)(bVar53 & 1) * auVar110._0_4_;
        bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar110._4_4_ = bVar58 * uVar135 | !bVar58 * auVar110._4_4_;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar110._8_4_ = bVar58 * uVar136 | !bVar58 * auVar110._8_4_;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar110._12_4_ = bVar58 * uVar137 | !bVar58 * auVar110._12_4_;
        bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar110._16_4_ = bVar58 * uVar138 | !bVar58 * auVar110._16_4_;
        bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar110._20_4_ = bVar58 * uVar139 | !bVar58 * auVar110._20_4_;
        bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar110._24_4_ = bVar58 * uVar140 | !bVar58 * auVar110._24_4_;
        bVar58 = SUB81(uVar61 >> 7,0);
        auVar110._28_4_ = bVar58 * uVar141 | !bVar58 * auVar110._28_4_;
        auVar84 = vblendmps_avx512vl(auVar221,auVar84);
        bVar58 = (bool)((byte)(uVar51 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar51 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar51 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar51 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar51 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar51 >> 6) & 1);
        bVar12 = SUB81(uVar51 >> 7,0);
        auVar111._0_4_ =
             (uint)(bVar53 & 1) *
             ((uint)(bVar49 & 1) * auVar84._0_4_ | !(bool)(bVar49 & 1) * uVar62) |
             !(bool)(bVar53 & 1) * auVar111._0_4_;
        bVar6 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar111._4_4_ =
             (uint)bVar6 * ((uint)bVar58 * auVar84._4_4_ | !bVar58 * uVar135) |
             !bVar6 * auVar111._4_4_;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar111._8_4_ =
             (uint)bVar58 * ((uint)bVar7 * auVar84._8_4_ | !bVar7 * uVar136) |
             !bVar58 * auVar111._8_4_;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar111._12_4_ =
             (uint)bVar58 * ((uint)bVar8 * auVar84._12_4_ | !bVar8 * uVar137) |
             !bVar58 * auVar111._12_4_;
        bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar111._16_4_ =
             (uint)bVar58 * ((uint)bVar9 * auVar84._16_4_ | !bVar9 * uVar138) |
             !bVar58 * auVar111._16_4_;
        bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar111._20_4_ =
             (uint)bVar58 * ((uint)bVar10 * auVar84._20_4_ | !bVar10 * uVar139) |
             !bVar58 * auVar111._20_4_;
        bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar111._24_4_ =
             (uint)bVar58 * ((uint)bVar11 * auVar84._24_4_ | !bVar11 * uVar140) |
             !bVar58 * auVar111._24_4_;
        bVar58 = SUB81(uVar61 >> 7,0);
        auVar111._28_4_ =
             (uint)bVar58 * ((uint)bVar12 * auVar84._28_4_ | !bVar12 * uVar141) |
             !bVar58 * auVar111._28_4_;
        bVar50 = (~bVar53 | bVar49) & bVar50;
      }
    }
    if ((bVar50 & 0x7f) == 0) {
      auVar115._8_4_ = 0x3f800000;
      auVar115._0_8_ = &DAT_3f8000003f800000;
      auVar115._12_4_ = 0x3f800000;
      auVar115._16_4_ = 0x3f800000;
      auVar115._20_4_ = 0x3f800000;
      auVar115._24_4_ = 0x3f800000;
      auVar115._28_4_ = 0x3f800000;
LAB_01b5be3f:
      auVar214 = ZEXT3264(_DAT_02020f20);
      auVar257 = ZEXT3264(auVar112);
      auVar250 = ZEXT3264(auVar95);
      auVar200 = ZEXT3264(auVar115);
      auVar264 = ZEXT3264(local_9a0);
      auVar127._32_32_ = auVar122;
      auVar134 = auVar127;
    }
    else {
      fVar225 = *(float *)(ray + k * 4 + 0x200) - (float)local_8c0._0_4_;
      auVar211._4_4_ = fVar225;
      auVar211._0_4_ = fVar225;
      auVar211._8_4_ = fVar225;
      auVar211._12_4_ = fVar225;
      auVar211._16_4_ = fVar225;
      auVar211._20_4_ = fVar225;
      auVar211._24_4_ = fVar225;
      auVar211._28_4_ = fVar225;
      auVar107 = vminps_avx512vl(auVar211,auVar111);
      auVar46._4_4_ = fStack_59c;
      auVar46._0_4_ = local_5a0;
      auVar46._8_4_ = fStack_598;
      auVar46._12_4_ = fStack_594;
      auVar46._16_4_ = fStack_590;
      auVar46._20_4_ = fStack_58c;
      auVar46._24_4_ = fStack_588;
      auVar46._28_4_ = fStack_584;
      auVar84 = vmaxps_avx512vl(auVar46,auVar110);
      auVar91 = vmulps_avx512vl(auVar91,auVar114);
      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar113,auVar91);
      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar112,auVar90);
      auVar90 = vmulps_avx512vl(local_680,auVar114);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_800,auVar113);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar129._0_32_,auVar112);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar90,auVar91);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar13 = vcmpps_avx512vl(auVar91,auVar112,1);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar89 = vxorps_avx512vl(auVar89,auVar113);
      auVar114 = vrcp14ps_avx512vl(auVar90);
      auVar108 = vxorps_avx512vl(auVar90,auVar113);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = vfnmadd213ps_avx512vl(auVar114,auVar90,auVar115);
      auVar109 = vfmadd132ps_avx512vl(auVar109,auVar114,auVar114);
      auVar89 = vmulps_avx512vl(auVar109,auVar89);
      uVar14 = vcmpps_avx512vl(auVar90,auVar108,1);
      bVar53 = (byte)uVar13 | (byte)uVar14;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar89,auVar109);
      auVar117._0_4_ =
           (uint)(bVar53 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar114._0_4_;
      bVar58 = (bool)(bVar53 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar58 * auVar116._4_4_ | (uint)!bVar58 * auVar114._4_4_;
      bVar58 = (bool)(bVar53 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar58 * auVar116._8_4_ | (uint)!bVar58 * auVar114._8_4_;
      bVar58 = (bool)(bVar53 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar58 * auVar116._12_4_ | (uint)!bVar58 * auVar114._12_4_;
      bVar58 = (bool)(bVar53 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar58 * auVar116._16_4_ | (uint)!bVar58 * auVar114._16_4_;
      bVar58 = (bool)(bVar53 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar58 * auVar116._20_4_ | (uint)!bVar58 * auVar114._20_4_;
      bVar58 = (bool)(bVar53 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar58 * auVar116._24_4_ | (uint)!bVar58 * auVar114._24_4_;
      auVar117._28_4_ =
           (uint)(bVar53 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar114._28_4_;
      auVar84 = vmaxps_avx(auVar84,auVar117);
      uVar14 = vcmpps_avx512vl(auVar90,auVar108,6);
      bVar53 = (byte)uVar13 | (byte)uVar14;
      auVar118._0_4_ = (uint)(bVar53 & 1) * 0x7f800000 | (uint)!(bool)(bVar53 & 1) * auVar89._0_4_;
      bVar58 = (bool)(bVar53 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar89._4_4_;
      bVar58 = (bool)(bVar53 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar89._8_4_;
      bVar58 = (bool)(bVar53 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar89._12_4_;
      bVar58 = (bool)(bVar53 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar89._16_4_;
      bVar58 = (bool)(bVar53 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar89._20_4_;
      bVar58 = (bool)(bVar53 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * auVar89._24_4_;
      auVar118._28_4_ =
           (uint)(bVar53 >> 7) * 0x7f800000 | (uint)!(bool)(bVar53 >> 7) * auVar89._28_4_;
      auVar89 = vminps_avx(auVar107,auVar118);
      auVar63 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar63),auVar94);
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar63),auVar95);
      auVar114 = ZEXT1632(auVar63);
      auVar96 = vsubps_avx512vl(auVar114,auVar96);
      auVar34._4_4_ = auVar96._4_4_ * auVar99._4_4_;
      auVar34._0_4_ = auVar96._0_4_ * auVar99._0_4_;
      auVar34._8_4_ = auVar96._8_4_ * auVar99._8_4_;
      auVar34._12_4_ = auVar96._12_4_ * auVar99._12_4_;
      auVar34._16_4_ = auVar96._16_4_ * auVar99._16_4_;
      auVar34._20_4_ = auVar96._20_4_ * auVar99._20_4_;
      auVar34._24_4_ = auVar96._24_4_ * auVar99._24_4_;
      auVar34._28_4_ = auVar96._28_4_;
      auVar94 = vfnmsub231ps_avx512vl(auVar34,auVar98,auVar94);
      auVar90 = vfnmadd231ps_avx512vl(auVar94,auVar97,auVar90);
      auVar94 = vmulps_avx512vl(local_680,auVar99);
      auVar94 = vfnmsub231ps_avx512vl(auVar94,local_800,auVar98);
      auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar129._0_32_,auVar97);
      vandps_avx512vl(auVar94,auVar91);
      uVar13 = vcmpps_avx512vl(auVar94,auVar112,1);
      auVar90 = vxorps_avx512vl(auVar90,auVar113);
      auVar91 = vrcp14ps_avx512vl(auVar94);
      auVar112 = vxorps_avx512vl(auVar94,auVar113);
      auVar96 = vfnmadd213ps_avx512vl(auVar91,auVar94,auVar115);
      auVar63 = vfmadd132ps_fma(auVar96,auVar91,auVar91);
      fVar225 = auVar63._0_4_ * auVar90._0_4_;
      fVar231 = auVar63._4_4_ * auVar90._4_4_;
      auVar35._4_4_ = fVar231;
      auVar35._0_4_ = fVar225;
      fVar232 = auVar63._8_4_ * auVar90._8_4_;
      auVar35._8_4_ = fVar232;
      fVar233 = auVar63._12_4_ * auVar90._12_4_;
      auVar35._12_4_ = fVar233;
      fVar234 = auVar90._16_4_ * 0.0;
      auVar35._16_4_ = fVar234;
      fVar235 = auVar90._20_4_ * 0.0;
      auVar35._20_4_ = fVar235;
      fVar254 = auVar90._24_4_ * 0.0;
      auVar35._24_4_ = fVar254;
      auVar35._28_4_ = auVar90._28_4_;
      uVar14 = vcmpps_avx512vl(auVar94,auVar112,1);
      bVar53 = (byte)uVar13 | (byte)uVar14;
      auVar96 = vblendmps_avx512vl(auVar35,auVar109);
      auVar119._0_4_ =
           (uint)(bVar53 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar91._0_4_;
      bVar58 = (bool)(bVar53 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar58 * auVar96._4_4_ | (uint)!bVar58 * auVar91._4_4_;
      bVar58 = (bool)(bVar53 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar58 * auVar96._8_4_ | (uint)!bVar58 * auVar91._8_4_;
      bVar58 = (bool)(bVar53 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar58 * auVar96._12_4_ | (uint)!bVar58 * auVar91._12_4_;
      bVar58 = (bool)(bVar53 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar58 * auVar96._16_4_ | (uint)!bVar58 * auVar91._16_4_;
      bVar58 = (bool)(bVar53 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar58 * auVar96._20_4_ | (uint)!bVar58 * auVar91._20_4_;
      bVar58 = (bool)(bVar53 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar58 * auVar96._24_4_ | (uint)!bVar58 * auVar91._24_4_;
      auVar119._28_4_ =
           (uint)(bVar53 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar91._28_4_;
      _local_860 = vmaxps_avx(auVar84,auVar119);
      uVar14 = vcmpps_avx512vl(auVar94,auVar112,6);
      bVar53 = (byte)uVar13 | (byte)uVar14;
      auVar95._0_4_ = (uint)(bVar53 & 1) * 0x7f800000 | (uint)!(bool)(bVar53 & 1) * (int)fVar225;
      bVar58 = (bool)(bVar53 >> 1 & 1);
      auVar95._4_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar231;
      bVar58 = (bool)(bVar53 >> 2 & 1);
      auVar95._8_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar232;
      bVar58 = (bool)(bVar53 >> 3 & 1);
      auVar95._12_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar233;
      bVar58 = (bool)(bVar53 >> 4 & 1);
      auVar95._16_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar234;
      bVar58 = (bool)(bVar53 >> 5 & 1);
      auVar95._20_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar235;
      bVar58 = (bool)(bVar53 >> 6 & 1);
      auVar95._24_4_ = (uint)bVar58 * 0x7f800000 | (uint)!bVar58 * (int)fVar254;
      auVar95._28_4_ =
           (uint)(bVar53 >> 7) * 0x7f800000 | (uint)!(bool)(bVar53 >> 7) * auVar90._28_4_;
      local_640 = vminps_avx(auVar89,auVar95);
      auVar247 = ZEXT3264(local_640);
      uVar13 = vcmpps_avx512vl(_local_860,local_640,2);
      bVar50 = bVar50 & 0x7f & (byte)uVar13;
      if (bVar50 == 0) goto LAB_01b5be3f;
      auVar89 = vmaxps_avx512vl(auVar114,auVar85);
      auVar84 = vminps_avx512vl(local_700,auVar115);
      auVar41 = ZEXT412(0);
      auVar85 = ZEXT1232(auVar41) << 0x20;
      auVar84 = vmaxps_avx(auVar84,ZEXT1232(auVar41) << 0x20);
      auVar90 = vminps_avx512vl(local_720,auVar115);
      auVar36._4_4_ = (auVar84._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar84._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar84._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar84._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar84._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar84._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar84._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar84._28_4_ + 7.0;
      auVar63 = vfmadd213ps_fma(auVar36,auVar153,auVar219);
      local_700 = ZEXT1632(auVar63);
      auVar84 = vmaxps_avx(auVar90,ZEXT1232(auVar41) << 0x20);
      auVar37._4_4_ = (auVar84._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar84._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar84._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar84._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar84._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar84._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar84._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar84._28_4_ + 7.0;
      auVar63 = vfmadd213ps_fma(auVar37,auVar153,auVar219);
      local_720 = ZEXT1632(auVar63);
      auVar212._0_4_ = auVar89._0_4_ * auVar89._0_4_;
      auVar212._4_4_ = auVar89._4_4_ * auVar89._4_4_;
      auVar212._8_4_ = auVar89._8_4_ * auVar89._8_4_;
      auVar212._12_4_ = auVar89._12_4_ * auVar89._12_4_;
      auVar212._16_4_ = auVar89._16_4_ * auVar89._16_4_;
      auVar212._20_4_ = auVar89._20_4_ * auVar89._20_4_;
      auVar212._24_4_ = auVar89._24_4_ * auVar89._24_4_;
      auVar212._28_4_ = 0;
      auVar84 = vsubps_avx(auVar101,auVar212);
      auVar257 = ZEXT3264(auVar84);
      auVar89 = vmulps_avx512vl(auVar100,auVar84);
      auVar89 = vsubps_avx512vl(auVar106,auVar89);
      uVar13 = vcmpps_avx512vl(auVar89,ZEXT1232(auVar41) << 0x20,5);
      bVar53 = (byte)uVar13;
      if (bVar53 == 0) {
        auVar87 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar83 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar89 = ZEXT832(0) << 0x20;
        auVar90 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar250 = ZEXT864(0) << 0x20;
        auVar120._8_4_ = 0x7f800000;
        auVar120._0_8_ = 0x7f8000007f800000;
        auVar120._12_4_ = 0x7f800000;
        auVar120._16_4_ = 0x7f800000;
        auVar120._20_4_ = 0x7f800000;
        auVar120._24_4_ = 0x7f800000;
        auVar120._28_4_ = 0x7f800000;
        auVar121._8_4_ = 0xff800000;
        auVar121._0_8_ = 0xff800000ff800000;
        auVar121._12_4_ = 0xff800000;
        auVar121._16_4_ = 0xff800000;
        auVar121._20_4_ = 0xff800000;
        auVar121._24_4_ = 0xff800000;
        auVar121._28_4_ = 0xff800000;
      }
      else {
        auVar67 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
        uVar61 = vcmpps_avx512vl(auVar89,auVar114,5);
        auVar85 = vsqrtps_avx(auVar89);
        auVar222._0_4_ = auVar86._0_4_ + auVar86._0_4_;
        auVar222._4_4_ = auVar86._4_4_ + auVar86._4_4_;
        auVar222._8_4_ = auVar86._8_4_ + auVar86._8_4_;
        auVar222._12_4_ = auVar86._12_4_ + auVar86._12_4_;
        auVar222._16_4_ = auVar86._16_4_ + auVar86._16_4_;
        auVar222._20_4_ = auVar86._20_4_ + auVar86._20_4_;
        auVar222._24_4_ = auVar86._24_4_ + auVar86._24_4_;
        auVar222._28_4_ = auVar86._28_4_ + auVar86._28_4_;
        auVar89 = vrcp14ps_avx512vl(auVar222);
        auVar90 = vfnmadd213ps_avx512vl(auVar222,auVar89,auVar115);
        auVar63 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
        auVar26._8_4_ = 0x80000000;
        auVar26._0_8_ = 0x8000000080000000;
        auVar26._12_4_ = 0x80000000;
        auVar26._16_4_ = 0x80000000;
        auVar26._20_4_ = 0x80000000;
        auVar26._24_4_ = 0x80000000;
        auVar26._28_4_ = 0x80000000;
        auVar89 = vxorps_avx512vl(auVar105,auVar26);
        auVar89 = vsubps_avx(auVar89,auVar85);
        auVar38._4_4_ = auVar89._4_4_ * auVar63._4_4_;
        auVar38._0_4_ = auVar89._0_4_ * auVar63._0_4_;
        auVar38._8_4_ = auVar89._8_4_ * auVar63._8_4_;
        auVar38._12_4_ = auVar89._12_4_ * auVar63._12_4_;
        auVar38._16_4_ = auVar89._16_4_ * 0.0;
        auVar38._20_4_ = auVar89._20_4_ * 0.0;
        auVar38._24_4_ = auVar89._24_4_ * 0.0;
        auVar38._28_4_ = 0x3e000000;
        auVar85 = vsubps_avx512vl(auVar85,auVar105);
        auVar39._4_4_ = auVar85._4_4_ * auVar63._4_4_;
        auVar39._0_4_ = auVar85._0_4_ * auVar63._0_4_;
        auVar39._8_4_ = auVar85._8_4_ * auVar63._8_4_;
        auVar39._12_4_ = auVar85._12_4_ * auVar63._12_4_;
        auVar39._16_4_ = auVar85._16_4_ * 0.0;
        auVar39._20_4_ = auVar85._20_4_ * 0.0;
        auVar39._24_4_ = auVar85._24_4_ * 0.0;
        auVar39._28_4_ = 0x7f800000;
        auVar63 = vfmadd213ps_fma(auVar102,auVar38,auVar103);
        auVar40._4_4_ = auVar88._4_4_ * auVar63._4_4_;
        auVar40._0_4_ = auVar88._0_4_ * auVar63._0_4_;
        auVar40._8_4_ = auVar88._8_4_ * auVar63._8_4_;
        auVar40._12_4_ = auVar88._12_4_ * auVar63._12_4_;
        auVar40._16_4_ = auVar88._16_4_ * 0.0;
        auVar40._20_4_ = auVar88._20_4_ * 0.0;
        auVar40._24_4_ = auVar88._24_4_ * 0.0;
        auVar40._28_4_ = auVar89._28_4_;
        auVar85 = vmulps_avx512vl(auVar129._0_32_,auVar38);
        auVar90 = vmulps_avx512vl(local_800,auVar38);
        auVar91 = vmulps_avx512vl(local_680,auVar38);
        auVar89 = vfmadd213ps_avx512vl(auVar83,auVar40,auVar92);
        auVar89 = vsubps_avx512vl(auVar85,auVar89);
        auVar85 = vfmadd213ps_avx512vl(auVar87,auVar40,local_820);
        auVar90 = vsubps_avx512vl(auVar90,auVar85);
        auVar63 = vfmadd213ps_fma(auVar40,local_840,auVar93);
        auVar85 = vsubps_avx(auVar91,ZEXT1632(auVar63));
        auVar250 = ZEXT3264(auVar85);
        auVar85 = vfmadd213ps_avx512vl(auVar102,auVar39,auVar103);
        auVar88 = vmulps_avx512vl(auVar88,auVar85);
        auVar85 = vmulps_avx512vl(auVar129._0_32_,auVar39);
        auVar91 = vmulps_avx512vl(local_800,auVar39);
        auVar100 = vmulps_avx512vl(local_680,auVar39);
        auVar83 = vfmadd213ps_avx512vl(auVar83,auVar88,auVar92);
        auVar85 = vsubps_avx(auVar85,auVar83);
        auVar63 = vfmadd213ps_fma(auVar87,auVar88,local_820);
        auVar87 = vsubps_avx512vl(auVar91,ZEXT1632(auVar63));
        auVar63 = vfmadd213ps_fma(local_840,auVar88,auVar93);
        auVar83 = vsubps_avx(auVar100,ZEXT1632(auVar63));
        auVar154._8_4_ = 0x7f800000;
        auVar154._0_8_ = 0x7f8000007f800000;
        auVar154._12_4_ = 0x7f800000;
        auVar154._16_4_ = 0x7f800000;
        auVar154._20_4_ = 0x7f800000;
        auVar154._24_4_ = 0x7f800000;
        auVar154._28_4_ = 0x7f800000;
        auVar88 = vblendmps_avx512vl(auVar154,auVar38);
        bVar58 = (bool)((byte)uVar61 & 1);
        auVar120._0_4_ = (uint)bVar58 * auVar88._0_4_ | (uint)!bVar58 * auVar100._0_4_;
        bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar58 * auVar88._4_4_ | (uint)!bVar58 * auVar100._4_4_;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar58 * auVar88._8_4_ | (uint)!bVar58 * auVar100._8_4_;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar58 * auVar88._12_4_ | (uint)!bVar58 * auVar100._12_4_;
        bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar120._16_4_ = (uint)bVar58 * auVar88._16_4_ | (uint)!bVar58 * auVar100._16_4_;
        bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar120._20_4_ = (uint)bVar58 * auVar88._20_4_ | (uint)!bVar58 * auVar100._20_4_;
        bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar120._24_4_ = (uint)bVar58 * auVar88._24_4_ | (uint)!bVar58 * auVar100._24_4_;
        bVar58 = SUB81(uVar61 >> 7,0);
        auVar120._28_4_ = (uint)bVar58 * auVar88._28_4_ | (uint)!bVar58 * auVar100._28_4_;
        auVar155._8_4_ = 0xff800000;
        auVar155._0_8_ = 0xff800000ff800000;
        auVar155._12_4_ = 0xff800000;
        auVar155._16_4_ = 0xff800000;
        auVar155._20_4_ = 0xff800000;
        auVar155._24_4_ = 0xff800000;
        auVar155._28_4_ = 0xff800000;
        auVar88 = vblendmps_avx512vl(auVar155,auVar39);
        bVar58 = (bool)((byte)uVar61 & 1);
        auVar121._0_4_ = (uint)bVar58 * auVar88._0_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar58 * auVar88._4_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar58 * auVar88._8_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar58 * auVar88._12_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar121._16_4_ = (uint)bVar58 * auVar88._16_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar121._20_4_ = (uint)bVar58 * auVar88._20_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar121._24_4_ = (uint)bVar58 * auVar88._24_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = SUB81(uVar61 >> 7,0);
        auVar121._28_4_ = (uint)bVar58 * auVar88._28_4_ | (uint)!bVar58 * -0x800000;
        auVar241._8_4_ = 0x7fffffff;
        auVar241._0_8_ = 0x7fffffff7fffffff;
        auVar241._12_4_ = 0x7fffffff;
        auVar241._16_4_ = 0x7fffffff;
        auVar241._20_4_ = 0x7fffffff;
        auVar241._24_4_ = 0x7fffffff;
        auVar241._28_4_ = 0x7fffffff;
        auVar88 = vandps_avx(auVar241,auVar104);
        auVar88 = vmaxps_avx(local_6a0,auVar88);
        auVar27._8_4_ = 0x36000000;
        auVar27._0_8_ = 0x3600000036000000;
        auVar27._12_4_ = 0x36000000;
        auVar27._16_4_ = 0x36000000;
        auVar27._20_4_ = 0x36000000;
        auVar27._24_4_ = 0x36000000;
        auVar27._28_4_ = 0x36000000;
        auVar88 = vmulps_avx512vl(auVar88,auVar27);
        auVar86 = vandps_avx(auVar86,auVar241);
        uVar51 = vcmpps_avx512vl(auVar86,auVar88,1);
        uVar61 = uVar61 & uVar51;
        bVar49 = (byte)uVar61;
        if (bVar49 != 0) {
          uVar51 = vcmpps_avx512vl(auVar84,ZEXT1632(auVar67),2);
          auVar242._8_4_ = 0xff800000;
          auVar242._0_8_ = 0xff800000ff800000;
          auVar242._12_4_ = 0xff800000;
          auVar242._16_4_ = 0xff800000;
          auVar242._20_4_ = 0xff800000;
          auVar242._24_4_ = 0xff800000;
          auVar242._28_4_ = 0xff800000;
          auVar256._8_4_ = 0x7f800000;
          auVar256._0_8_ = 0x7f8000007f800000;
          auVar256._12_4_ = 0x7f800000;
          auVar256._16_4_ = 0x7f800000;
          auVar256._20_4_ = 0x7f800000;
          auVar256._24_4_ = 0x7f800000;
          auVar256._28_4_ = 0x7f800000;
          auVar257 = ZEXT3264(auVar256);
          auVar86 = vblendmps_avx512vl(auVar256,auVar242);
          bVar52 = (byte)uVar51;
          uVar62 = (uint)(bVar52 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar88._0_4_;
          bVar58 = (bool)((byte)(uVar51 >> 1) & 1);
          uVar135 = (uint)bVar58 * auVar86._4_4_ | (uint)!bVar58 * auVar88._4_4_;
          bVar58 = (bool)((byte)(uVar51 >> 2) & 1);
          uVar136 = (uint)bVar58 * auVar86._8_4_ | (uint)!bVar58 * auVar88._8_4_;
          bVar58 = (bool)((byte)(uVar51 >> 3) & 1);
          uVar137 = (uint)bVar58 * auVar86._12_4_ | (uint)!bVar58 * auVar88._12_4_;
          bVar58 = (bool)((byte)(uVar51 >> 4) & 1);
          uVar138 = (uint)bVar58 * auVar86._16_4_ | (uint)!bVar58 * auVar88._16_4_;
          bVar58 = (bool)((byte)(uVar51 >> 5) & 1);
          uVar139 = (uint)bVar58 * auVar86._20_4_ | (uint)!bVar58 * auVar88._20_4_;
          bVar58 = (bool)((byte)(uVar51 >> 6) & 1);
          uVar140 = (uint)bVar58 * auVar86._24_4_ | (uint)!bVar58 * auVar88._24_4_;
          bVar58 = SUB81(uVar51 >> 7,0);
          uVar141 = (uint)bVar58 * auVar86._28_4_ | (uint)!bVar58 * auVar88._28_4_;
          auVar120._0_4_ = (bVar49 & 1) * uVar62 | !(bool)(bVar49 & 1) * auVar120._0_4_;
          bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar120._4_4_ = bVar58 * uVar135 | !bVar58 * auVar120._4_4_;
          bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar120._8_4_ = bVar58 * uVar136 | !bVar58 * auVar120._8_4_;
          bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar120._12_4_ = bVar58 * uVar137 | !bVar58 * auVar120._12_4_;
          bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar120._16_4_ = bVar58 * uVar138 | !bVar58 * auVar120._16_4_;
          bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar120._20_4_ = bVar58 * uVar139 | !bVar58 * auVar120._20_4_;
          bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar120._24_4_ = bVar58 * uVar140 | !bVar58 * auVar120._24_4_;
          bVar58 = SUB81(uVar61 >> 7,0);
          auVar120._28_4_ = bVar58 * uVar141 | !bVar58 * auVar120._28_4_;
          auVar86 = vblendmps_avx512vl(auVar242,auVar256);
          bVar58 = (bool)((byte)(uVar51 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar51 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar51 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar51 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar51 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar51 >> 6) & 1);
          bVar12 = SUB81(uVar51 >> 7,0);
          auVar121._0_4_ =
               (uint)(bVar49 & 1) *
               ((uint)(bVar52 & 1) * auVar86._0_4_ | !(bool)(bVar52 & 1) * uVar62) |
               !(bool)(bVar49 & 1) * auVar121._0_4_;
          bVar6 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar121._4_4_ =
               (uint)bVar6 * ((uint)bVar58 * auVar86._4_4_ | !bVar58 * uVar135) |
               !bVar6 * auVar121._4_4_;
          bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar121._8_4_ =
               (uint)bVar58 * ((uint)bVar7 * auVar86._8_4_ | !bVar7 * uVar136) |
               !bVar58 * auVar121._8_4_;
          bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar121._12_4_ =
               (uint)bVar58 * ((uint)bVar8 * auVar86._12_4_ | !bVar8 * uVar137) |
               !bVar58 * auVar121._12_4_;
          bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar121._16_4_ =
               (uint)bVar58 * ((uint)bVar9 * auVar86._16_4_ | !bVar9 * uVar138) |
               !bVar58 * auVar121._16_4_;
          bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar121._20_4_ =
               (uint)bVar58 * ((uint)bVar10 * auVar86._20_4_ | !bVar10 * uVar139) |
               !bVar58 * auVar121._20_4_;
          bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar121._24_4_ =
               (uint)bVar58 * ((uint)bVar11 * auVar86._24_4_ | !bVar11 * uVar140) |
               !bVar58 * auVar121._24_4_;
          bVar58 = SUB81(uVar61 >> 7,0);
          auVar121._28_4_ =
               (uint)bVar58 * ((uint)bVar12 * auVar86._28_4_ | !bVar12 * uVar141) |
               !bVar58 * auVar121._28_4_;
          bVar53 = (~bVar49 | bVar52) & bVar53;
        }
      }
      auVar264 = ZEXT3264(local_9a0);
      auVar86 = vmulps_avx512vl(local_680,auVar83);
      auVar86 = vfmadd231ps_avx512vl(auVar86,local_800,auVar87);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar129._0_32_,auVar85);
      _local_500 = _local_860;
      local_4e0 = vminps_avx(local_640,auVar120);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar86 = vandps_avx(auVar86,auVar230);
      _local_760 = vmaxps_avx(_local_860,auVar121);
      _local_660 = _local_760;
      auVar156._8_4_ = 0x3e99999a;
      auVar156._0_8_ = 0x3e99999a3e99999a;
      auVar156._12_4_ = 0x3e99999a;
      auVar156._16_4_ = 0x3e99999a;
      auVar156._20_4_ = 0x3e99999a;
      auVar156._24_4_ = 0x3e99999a;
      auVar156._28_4_ = 0x3e99999a;
      uVar13 = vcmpps_avx512vl(auVar86,auVar156,1);
      uVar14 = vcmpps_avx512vl(_local_860,local_4e0,2);
      bVar49 = (byte)uVar14 & bVar50;
      uVar15 = vcmpps_avx512vl(_local_760,local_640,2);
      auVar128._32_32_ = auVar122;
      auVar134 = auVar128;
      if ((bVar50 & ((byte)uVar15 | (byte)uVar14)) != 0) {
        auVar86 = vmulps_avx512vl(local_680,auVar250._0_32_);
        auVar86 = vfmadd213ps_avx512vl(auVar90,local_800,auVar86);
        auVar86 = vfmadd213ps_avx512vl(auVar89,auVar129._0_32_,auVar86);
        auVar86 = vandps_avx(auVar86,auVar230);
        uVar14 = vcmpps_avx512vl(auVar86,auVar156,1);
        bVar52 = (byte)uVar14 | ~bVar53;
        auVar157._8_4_ = 2;
        auVar157._0_8_ = 0x200000002;
        auVar157._12_4_ = 2;
        auVar157._16_4_ = 2;
        auVar157._20_4_ = 2;
        auVar157._24_4_ = 2;
        auVar157._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar86 = vpblendmd_avx512vl(auVar157,auVar28);
        local_620._0_4_ = (uint)(bVar52 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar52 & 1) * 2;
        bVar58 = (bool)(bVar52 >> 1 & 1);
        local_620._4_4_ = (uint)bVar58 * auVar86._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 2 & 1);
        local_620._8_4_ = (uint)bVar58 * auVar86._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 3 & 1);
        local_620._12_4_ = (uint)bVar58 * auVar86._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 4 & 1);
        local_620._16_4_ = (uint)bVar58 * auVar86._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 5 & 1);
        local_620._20_4_ = (uint)bVar58 * auVar86._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 6 & 1);
        local_620._24_4_ = (uint)bVar58 * auVar86._24_4_ | (uint)!bVar58 * 2;
        local_620._28_4_ = (uint)(bVar52 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar52 >> 7) * 2;
        auVar214._0_32_ = vpbroadcastd_avx512vl();
        auVar214._32_32_ = auVar122;
        local_6c0 = auVar214._0_32_;
        uVar14 = vpcmpd_avx512vl(auVar214._0_32_,local_620,5);
        bVar52 = (byte)uVar14 & bVar49;
        if (bVar52 == 0) {
          auVar247 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        }
        else {
          auVar67 = vminps_avx(local_900._0_16_,local_940._0_16_);
          auVar63 = vmaxps_avx(local_900._0_16_,local_940._0_16_);
          auVar75 = vminps_avx(local_920._0_16_,local_960._0_16_);
          auVar64 = vminps_avx(auVar67,auVar75);
          auVar67 = vmaxps_avx(local_920._0_16_,local_960._0_16_);
          auVar75 = vmaxps_avx(auVar63,auVar67);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar63 = vandps_avx(auVar64,auVar186);
          auVar67 = vandps_avx(auVar75,auVar186);
          auVar63 = vmaxps_avx(auVar63,auVar67);
          auVar67 = vmovshdup_avx(auVar63);
          auVar67 = vmaxss_avx(auVar67,auVar63);
          auVar63 = vshufpd_avx(auVar63,auVar63,1);
          auVar63 = vmaxss_avx(auVar63,auVar67);
          fVar225 = auVar63._0_4_ * 1.9073486e-06;
          local_8d0 = vshufps_avx(auVar75,auVar75,0xff);
          local_740 = (float)local_860._0_4_ + (float)local_7e0._0_4_;
          fStack_73c = (float)local_860._4_4_ + (float)local_7e0._4_4_;
          fStack_738 = fStack_858 + fStack_7d8;
          fStack_734 = fStack_854 + fStack_7d4;
          fStack_730 = fStack_850 + fStack_7d0;
          fStack_72c = fStack_84c + fStack_7cc;
          fStack_728 = fStack_848 + fStack_7c8;
          fStack_724 = fStack_844 + fStack_7c4;
          do {
            auVar158._8_4_ = 0x7f800000;
            auVar158._0_8_ = 0x7f8000007f800000;
            auVar158._12_4_ = 0x7f800000;
            auVar158._16_4_ = 0x7f800000;
            auVar158._20_4_ = 0x7f800000;
            auVar158._24_4_ = 0x7f800000;
            auVar158._28_4_ = 0x7f800000;
            auVar122 = vblendmps_avx512vl(auVar158,_local_860);
            auVar123._0_4_ =
                 (uint)(bVar52 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 1 & 1);
            auVar123._4_4_ = (uint)bVar58 * auVar122._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 2 & 1);
            auVar123._8_4_ = (uint)bVar58 * auVar122._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 3 & 1);
            auVar123._12_4_ = (uint)bVar58 * auVar122._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 4 & 1);
            auVar123._16_4_ = (uint)bVar58 * auVar122._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar52 >> 5 & 1);
            auVar123._20_4_ = (uint)bVar58 * auVar122._20_4_ | (uint)!bVar58 * 0x7f800000;
            auVar123._24_4_ =
                 (uint)(bVar52 >> 6) * auVar122._24_4_ | (uint)!(bool)(bVar52 >> 6) * 0x7f800000;
            auVar123._28_4_ = 0x7f800000;
            auVar214._0_32_ = auVar123;
            auVar122 = vshufps_avx(auVar123,auVar123,0xb1);
            auVar122 = vminps_avx(auVar123,auVar122);
            auVar86 = vshufpd_avx(auVar122,auVar122,5);
            auVar122 = vminps_avx(auVar122,auVar86);
            auVar86 = vpermpd_avx2(auVar122,0x4e);
            auVar122 = vminps_avx(auVar122,auVar86);
            uVar14 = vcmpps_avx512vl(auVar123,auVar122,0);
            bVar47 = (byte)uVar14 & bVar52;
            bVar56 = bVar52;
            if (bVar47 != 0) {
              bVar56 = bVar47;
            }
            iVar16 = 0;
            for (uVar62 = (uint)bVar56; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            bVar56 = '\x01' << ((byte)iVar16 & 0x1f);
            uVar62 = *(uint *)(local_700 + (uint)(iVar16 << 2));
            fVar231 = *(float *)(local_500 + (uint)(iVar16 << 2));
            fVar232 = auVar66._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              fVar232 = sqrtf((float)local_980._0_4_);
            }
            auVar250 = ZEXT464(uVar62);
            bVar47 = ~bVar56;
            lVar57 = 5;
            do {
              auVar122 = auVar214._32_32_;
              auVar145._4_4_ = fVar231;
              auVar145._0_4_ = fVar231;
              auVar145._8_4_ = fVar231;
              auVar145._12_4_ = fVar231;
              auVar63 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_970);
              fVar249 = auVar250._0_4_;
              fVar236 = 1.0 - fVar249;
              auVar69 = SUB6416(ZEXT464(0x40400000),0);
              auVar240 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar65 = auVar250._0_16_;
              auVar75 = vfmadd213ss_fma(auVar69,auVar65,auVar240);
              auVar67 = vfmadd213ss_fma(auVar75,ZEXT416((uint)(fVar249 * fVar249)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar64 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar236),auVar240);
              auVar64 = vfmadd213ss_fma(auVar64,ZEXT416((uint)(fVar236 * fVar236)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar233 = fVar236 * fVar236 * -fVar249 * 0.5;
              fVar234 = auVar67._0_4_ * 0.5;
              fVar235 = auVar64._0_4_ * 0.5;
              fVar254 = fVar249 * fVar249 * -fVar236 * 0.5;
              auVar204._0_4_ = fVar254 * (float)local_960._0_4_;
              auVar204._4_4_ = fVar254 * (float)local_960._4_4_;
              auVar204._8_4_ = fVar254 * fStack_958;
              auVar204._12_4_ = fVar254 * fStack_954;
              auVar217._4_4_ = fVar235;
              auVar217._0_4_ = fVar235;
              auVar217._8_4_ = fVar235;
              auVar217._12_4_ = fVar235;
              auVar67 = vfmadd132ps_fma(auVar217,auVar204,local_920._0_16_);
              auVar187._4_4_ = fVar234;
              auVar187._0_4_ = fVar234;
              auVar187._8_4_ = fVar234;
              auVar187._12_4_ = fVar234;
              auVar67 = vfmadd132ps_fma(auVar187,auVar67,local_940._0_16_);
              auVar205._4_4_ = fVar233;
              auVar205._0_4_ = fVar233;
              auVar205._8_4_ = fVar233;
              auVar205._12_4_ = fVar233;
              auVar67 = vfmadd132ps_fma(auVar205,auVar67,local_900._0_16_);
              auVar64 = vfmadd231ss_fma(auVar240,auVar65,ZEXT416(0x41100000));
              local_840._0_16_ = auVar64;
              local_870 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar65,ZEXT416(0x40800000)
                                         );
              local_880 = vfmadd213ss_fma(auVar69,auVar65,ZEXT416(0xbf800000));
              local_820._0_16_ = auVar67;
              auVar67 = vsubps_avx(auVar63,auVar67);
              auVar63 = vdpps_avx(auVar67,auVar67,0x7f);
              fVar233 = auVar63._0_4_;
              if (fVar233 < 0.0) {
                auVar247._0_4_ = sqrtf(fVar233);
                auVar247._4_60_ = extraout_var;
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar64 = auVar247._0_16_;
              }
              else {
                auVar64 = vsqrtss_avx(auVar63,auVar63);
              }
              auVar70 = vfnmadd231ss_fma(ZEXT416((uint)(fVar249 * (fVar236 + fVar236))),
                                         ZEXT416((uint)fVar236),ZEXT416((uint)fVar236));
              auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)(fVar249 + fVar249)),
                                        ZEXT416((uint)(fVar249 * fVar249 * 3.0)));
              auVar240 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar65,
                                         SUB6416(ZEXT464(0x40000000),0));
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar236 * -3.0)),
                                        ZEXT416((uint)(fVar236 + fVar236)),auVar240);
              auVar240 = vfmadd213ss_fma(ZEXT416((uint)(fVar236 * -2.0)),auVar65,
                                         ZEXT416((uint)(fVar249 * fVar249)));
              fVar234 = auVar70._0_4_ * 0.5;
              fVar235 = auVar75._0_4_ * 0.5;
              fVar254 = auVar69._0_4_ * 0.5;
              fVar236 = auVar240._0_4_ * 0.5;
              auVar206._0_4_ = fVar236 * (float)local_960._0_4_;
              auVar206._4_4_ = fVar236 * (float)local_960._4_4_;
              auVar206._8_4_ = fVar236 * fStack_958;
              auVar206._12_4_ = fVar236 * fStack_954;
              auVar188._4_4_ = fVar254;
              auVar188._0_4_ = fVar254;
              auVar188._8_4_ = fVar254;
              auVar188._12_4_ = fVar254;
              auVar75 = vfmadd132ps_fma(auVar188,auVar206,local_920._0_16_);
              auVar167._4_4_ = fVar235;
              auVar167._0_4_ = fVar235;
              auVar167._8_4_ = fVar235;
              auVar167._12_4_ = fVar235;
              auVar75 = vfmadd132ps_fma(auVar167,auVar75,local_940._0_16_);
              auVar262._4_4_ = fVar234;
              auVar262._0_4_ = fVar234;
              auVar262._8_4_ = fVar234;
              auVar262._12_4_ = fVar234;
              auVar240 = vfmadd132ps_fma(auVar262,auVar75,local_900._0_16_);
              auVar75 = vdpps_avx(auVar240,auVar240,0x7f);
              auVar42._12_4_ = 0;
              auVar42._0_12_ = ZEXT812(0);
              fVar234 = auVar75._0_4_;
              auVar69 = vrsqrt14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar234));
              fVar235 = auVar69._0_4_;
              auVar70 = vrcp14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar234));
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar71 = vxorps_avx512vl(auVar75,auVar18);
              auVar69 = vfnmadd213ss_fma(auVar70,auVar75,SUB6416(ZEXT464(0x40000000),0));
              uVar62 = auVar64._0_4_;
              if (fVar234 < auVar71._0_4_) {
                fVar254 = sqrtf(fVar234);
                auVar64 = ZEXT416(uVar62);
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                fVar254 = auVar75._0_4_;
              }
              fVar235 = fVar235 * 1.5 + fVar234 * -0.5 * fVar235 * fVar235 * fVar235;
              auVar146._0_4_ = auVar240._0_4_ * fVar235;
              auVar146._4_4_ = auVar240._4_4_ * fVar235;
              auVar146._8_4_ = auVar240._8_4_ * fVar235;
              auVar146._12_4_ = auVar240._12_4_ * fVar235;
              auVar75 = vdpps_avx(auVar67,auVar146,0x7f);
              fVar237 = auVar64._0_4_;
              auVar147._0_4_ = auVar75._0_4_ * auVar75._0_4_;
              auVar147._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar147._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar147._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar72 = vsubps_avx512vl(auVar63,auVar147);
              fVar236 = auVar72._0_4_;
              auVar168._4_12_ = ZEXT812(0) << 0x20;
              auVar168._0_4_ = fVar236;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
              auVar73 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              if (fVar236 < 0.0) {
                local_8b0 = fVar235;
                fStack_8ac = fVar235;
                fStack_8a8 = fVar235;
                fStack_8a4 = fVar235;
                local_8a0 = auVar71;
                local_890 = auVar75;
                fVar142 = sqrtf(fVar236);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar64 = ZEXT416(uVar62);
                auVar75 = local_890;
                auVar71 = local_8a0;
                fVar235 = local_8b0;
                fVar243 = fStack_8ac;
                fVar244 = fStack_8a8;
                fVar248 = fStack_8a4;
              }
              else {
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                fVar142 = auVar72._0_4_;
                fVar243 = fVar235;
                fVar244 = fVar235;
                fVar248 = fVar235;
              }
              auVar257 = ZEXT1664(auVar67);
              auVar245._8_4_ = 0x7fffffff;
              auVar245._0_8_ = 0x7fffffff7fffffff;
              auVar245._12_4_ = 0x7fffffff;
              auVar247 = ZEXT1664(auVar245);
              auVar250._32_32_ = auVar122;
              auVar250._0_32_ = auVar127._0_32_;
              auVar169._0_4_ = (float)local_880._0_4_ * (float)local_960._0_4_;
              auVar169._4_4_ = (float)local_880._0_4_ * (float)local_960._4_4_;
              auVar169._8_4_ = (float)local_880._0_4_ * fStack_958;
              auVar169._12_4_ = (float)local_880._0_4_ * fStack_954;
              auVar189._4_4_ = local_870._0_4_;
              auVar189._0_4_ = local_870._0_4_;
              auVar189._8_4_ = local_870._0_4_;
              auVar189._12_4_ = local_870._0_4_;
              auVar72 = vfmadd132ps_fma(auVar189,auVar169,local_920._0_16_);
              auVar170._4_4_ = local_840._0_4_;
              auVar170._0_4_ = local_840._0_4_;
              auVar170._8_4_ = local_840._0_4_;
              auVar170._12_4_ = local_840._0_4_;
              auVar72 = vfmadd132ps_fma(auVar170,auVar72,local_940._0_16_);
              auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar65,ZEXT416(0x40000000));
              auVar190._0_4_ = auVar65._0_4_;
              auVar190._4_4_ = auVar190._0_4_;
              auVar190._8_4_ = auVar190._0_4_;
              auVar190._12_4_ = auVar190._0_4_;
              auVar65 = vfmadd132ps_fma(auVar190,auVar72,local_900._0_16_);
              auVar171._0_4_ = auVar65._0_4_ * fVar234;
              auVar171._4_4_ = auVar65._4_4_ * fVar234;
              auVar171._8_4_ = auVar65._8_4_ * fVar234;
              auVar171._12_4_ = auVar65._12_4_ * fVar234;
              auVar65 = vdpps_avx(auVar240,auVar65,0x7f);
              fVar234 = auVar65._0_4_;
              auVar191._0_4_ = auVar240._0_4_ * fVar234;
              auVar191._4_4_ = auVar240._4_4_ * fVar234;
              auVar191._8_4_ = auVar240._8_4_ * fVar234;
              auVar191._12_4_ = auVar240._12_4_ * fVar234;
              auVar65 = vsubps_avx(auVar171,auVar191);
              local_bf0 = auVar70._0_4_;
              local_bf0 = auVar69._0_4_ * local_bf0;
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar225),
                                   ZEXT416((uint)(fVar231 * fVar232 * 1.9073486e-06)));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar264._16_48_ = auVar250._16_48_;
              auVar74 = vxorps_avx512vl(auVar240,auVar19);
              auVar192._0_4_ = fVar235 * auVar65._0_4_ * local_bf0;
              auVar192._4_4_ = fVar243 * auVar65._4_4_ * local_bf0;
              auVar192._8_4_ = fVar244 * auVar65._8_4_ * local_bf0;
              auVar192._12_4_ = fVar248 * auVar65._12_4_ * local_bf0;
              auVar69 = vdpps_avx(auVar74,auVar146,0x7f);
              auVar65 = vfmadd213ss_fma(auVar64,ZEXT416((uint)fVar225),auVar70);
              auVar64 = vdpps_avx(auVar67,auVar192,0x7f);
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),
                                        ZEXT416((uint)(fVar225 / fVar254)),auVar65);
              fVar234 = auVar69._0_4_ + auVar64._0_4_;
              auVar64 = vdpps_avx(local_970,auVar146,0x7f);
              auVar69 = vdpps_avx(auVar67,auVar74,0x7f);
              auVar65 = vmulss_avx512f(auVar71,ZEXT416((uint)(fVar236 * -0.5)));
              auVar71 = vmulss_avx512f(auVar71,auVar71);
              auVar74 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar65._0_4_ * auVar71._0_4_)));
              auVar65 = vdpps_avx(auVar67,local_970,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar69,auVar75,ZEXT416((uint)fVar234));
              auVar73 = vfnmadd231ss_fma(auVar65,auVar75,auVar64);
              auVar69 = vpermilps_avx(local_820._0_16_,0xff);
              fVar142 = fVar142 - auVar69._0_4_;
              auVar69 = vshufps_avx(auVar240,auVar240,0xff);
              auVar65 = vfmsub213ss_fma(auVar71,auVar74,auVar69);
              fVar235 = auVar73._0_4_ * auVar74._0_4_;
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar65._0_4_)),
                                        ZEXT416((uint)fVar234),ZEXT416((uint)fVar235));
              fVar254 = auVar71._0_4_;
              fVar249 = fVar249 - (auVar75._0_4_ * (fVar235 / fVar254) -
                                  fVar142 * (auVar64._0_4_ / fVar254));
              auVar250 = ZEXT464((uint)fVar249);
              fVar231 = fVar231 - (fVar142 * (fVar234 / fVar254) -
                                  auVar75._0_4_ * (auVar65._0_4_ / fVar254));
              auVar75 = vandps_avx(auVar75,auVar245);
              bVar58 = true;
              if (auVar72._0_4_ <= auVar75._0_4_) {
LAB_01b5c81a:
                auVar129._32_32_ = auVar122;
                auVar214 = auVar129;
              }
              else {
                auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ + auVar70._0_4_)),local_8d0,
                                          ZEXT416(0x36000000));
                auVar75 = vandps_avx(auVar245,ZEXT416((uint)fVar142));
                if (auVar64._0_4_ <= auVar75._0_4_) goto LAB_01b5c81a;
                fVar231 = fVar231 + (float)local_8c0._0_4_;
                if ((((fVar231 < fVar164) ||
                     (fVar234 = *(float *)(ray + k * 4 + 0x200), fVar234 < fVar231)) ||
                    (fVar249 < 0.0)) || (1.0 < fVar249)) {
LAB_01b5c817:
                  bVar58 = false;
                  bVar56 = 0;
                  goto LAB_01b5c81a;
                }
                auVar264._0_16_ = ZEXT816(0) << 0x20;
                auVar130._4_60_ = auVar264._4_60_;
                auVar130._0_4_ = fVar233;
                auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar130._0_16_);
                fVar233 = auVar75._0_4_;
                auVar63 = vmulss_avx512f(auVar63,ZEXT416(0xbf000000));
                pGVar4 = (context->scene->geometries).items[uVar54].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01b5c817;
                auVar214._32_32_ = auVar122;
                auVar214._0_32_ = auVar129._0_32_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar56 = true;
                }
                else {
                  fVar233 = fVar233 * 1.5 + auVar63._0_4_ * fVar233 * fVar233 * fVar233;
                  auVar172._0_4_ = auVar67._0_4_ * fVar233;
                  auVar172._4_4_ = auVar67._4_4_ * fVar233;
                  auVar172._8_4_ = auVar67._8_4_ * fVar233;
                  auVar172._12_4_ = auVar67._12_4_ * fVar233;
                  auVar69 = vfmadd213ps_fma(auVar69,auVar172,auVar240);
                  auVar63 = vshufps_avx(auVar172,auVar172,0xc9);
                  auVar75 = vshufps_avx(auVar240,auVar240,0xc9);
                  auVar173._0_4_ = auVar172._0_4_ * auVar75._0_4_;
                  auVar173._4_4_ = auVar172._4_4_ * auVar75._4_4_;
                  auVar173._8_4_ = auVar172._8_4_ * auVar75._8_4_;
                  auVar173._12_4_ = auVar172._12_4_ * auVar75._12_4_;
                  auVar64 = vfmsub231ps_fma(auVar173,auVar240,auVar63);
                  auVar63 = vshufps_avx(auVar64,auVar64,0xc9);
                  auVar75 = vshufps_avx(auVar69,auVar69,0xc9);
                  auVar64 = vshufps_avx(auVar64,auVar64,0xd2);
                  auVar148._0_4_ = auVar69._0_4_ * auVar64._0_4_;
                  auVar148._4_4_ = auVar69._4_4_ * auVar64._4_4_;
                  auVar148._8_4_ = auVar69._8_4_ * auVar64._8_4_;
                  auVar148._12_4_ = auVar69._12_4_ * auVar64._12_4_;
                  auVar63 = vfmsub231ps_fma(auVar148,auVar63,auVar75);
                  auVar75 = ZEXT416((uint)fVar249);
                  local_340 = vbroadcastss_avx512f(auVar75);
                  auVar163 = vbroadcastss_avx512f(ZEXT416(1));
                  auVar163 = vpermps_avx512f(auVar163,ZEXT1664(auVar63));
                  auVar200 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar200,ZEXT1664(auVar63));
                  local_380 = vbroadcastss_avx512f(auVar63);
                  local_400[0] = (RTCHitN)auVar163[0];
                  local_400[1] = (RTCHitN)auVar163[1];
                  local_400[2] = (RTCHitN)auVar163[2];
                  local_400[3] = (RTCHitN)auVar163[3];
                  local_400[4] = (RTCHitN)auVar163[4];
                  local_400[5] = (RTCHitN)auVar163[5];
                  local_400[6] = (RTCHitN)auVar163[6];
                  local_400[7] = (RTCHitN)auVar163[7];
                  local_400[8] = (RTCHitN)auVar163[8];
                  local_400[9] = (RTCHitN)auVar163[9];
                  local_400[10] = (RTCHitN)auVar163[10];
                  local_400[0xb] = (RTCHitN)auVar163[0xb];
                  local_400[0xc] = (RTCHitN)auVar163[0xc];
                  local_400[0xd] = (RTCHitN)auVar163[0xd];
                  local_400[0xe] = (RTCHitN)auVar163[0xe];
                  local_400[0xf] = (RTCHitN)auVar163[0xf];
                  local_400[0x10] = (RTCHitN)auVar163[0x10];
                  local_400[0x11] = (RTCHitN)auVar163[0x11];
                  local_400[0x12] = (RTCHitN)auVar163[0x12];
                  local_400[0x13] = (RTCHitN)auVar163[0x13];
                  local_400[0x14] = (RTCHitN)auVar163[0x14];
                  local_400[0x15] = (RTCHitN)auVar163[0x15];
                  local_400[0x16] = (RTCHitN)auVar163[0x16];
                  local_400[0x17] = (RTCHitN)auVar163[0x17];
                  local_400[0x18] = (RTCHitN)auVar163[0x18];
                  local_400[0x19] = (RTCHitN)auVar163[0x19];
                  local_400[0x1a] = (RTCHitN)auVar163[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar163[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar163[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar163[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar163[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar163[0x1f];
                  local_400[0x20] = (RTCHitN)auVar163[0x20];
                  local_400[0x21] = (RTCHitN)auVar163[0x21];
                  local_400[0x22] = (RTCHitN)auVar163[0x22];
                  local_400[0x23] = (RTCHitN)auVar163[0x23];
                  local_400[0x24] = (RTCHitN)auVar163[0x24];
                  local_400[0x25] = (RTCHitN)auVar163[0x25];
                  local_400[0x26] = (RTCHitN)auVar163[0x26];
                  local_400[0x27] = (RTCHitN)auVar163[0x27];
                  local_400[0x28] = (RTCHitN)auVar163[0x28];
                  local_400[0x29] = (RTCHitN)auVar163[0x29];
                  local_400[0x2a] = (RTCHitN)auVar163[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar163[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar163[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar163[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar163[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar163[0x2f];
                  local_400[0x30] = (RTCHitN)auVar163[0x30];
                  local_400[0x31] = (RTCHitN)auVar163[0x31];
                  local_400[0x32] = (RTCHitN)auVar163[0x32];
                  local_400[0x33] = (RTCHitN)auVar163[0x33];
                  local_400[0x34] = (RTCHitN)auVar163[0x34];
                  local_400[0x35] = (RTCHitN)auVar163[0x35];
                  local_400[0x36] = (RTCHitN)auVar163[0x36];
                  local_400[0x37] = (RTCHitN)auVar163[0x37];
                  local_400[0x38] = (RTCHitN)auVar163[0x38];
                  local_400[0x39] = (RTCHitN)auVar163[0x39];
                  local_400[0x3a] = (RTCHitN)auVar163[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar163[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar163[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar163[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar163[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar163[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_440._0_8_;
                  uStack_2b8 = local_440._8_8_;
                  uStack_2b0 = local_440._16_8_;
                  uStack_2a8 = local_440._24_8_;
                  uStack_2a0 = local_440._32_8_;
                  uStack_298 = local_440._40_8_;
                  uStack_290 = local_440._48_8_;
                  uStack_288 = local_440._56_8_;
                  auVar163 = vmovdqa64_avx512f(local_480);
                  local_280 = vmovdqa64_avx512f(auVar163);
                  vpcmpeqd_avx2(auVar163._0_32_,auVar163._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar231;
                  local_7c0 = local_4c0;
                  local_9d0.valid = (int *)local_7c0;
                  local_9d0.geometryUserPtr = pGVar4->userPtr;
                  local_9d0.context = context->user;
                  local_9d0.hit = local_400;
                  local_9d0.N = 0x10;
                  local_9d0.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar257 = ZEXT1664(auVar67);
                    (*pGVar4->occlusionFilterN)(&local_9d0);
                    auVar250 = ZEXT1664(auVar75);
                    auVar247 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)
                                                 ));
                  }
                  auVar214 = vmovdqa64_avx512f(local_7c0);
                  uVar14 = vptestmd_avx512f(auVar214,auVar214);
                  if ((short)uVar14 == 0) {
                    bVar56 = false;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar257 = ZEXT1664(auVar257._0_16_);
                      (*p_Var5)(&local_9d0);
                      auVar250 = ZEXT1664(auVar75);
                      auVar247 = ZEXT1664(CONCAT412(0x7fffffff,
                                                    CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                    }
                    auVar163 = vmovdqa64_avx512f(local_7c0);
                    uVar61 = vptestmd_avx512f(auVar163,auVar163);
                    auVar163 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar58 = (bool)((byte)uVar61 & 1);
                    auVar214._0_4_ =
                         (uint)bVar58 * auVar163._0_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x200);
                    bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
                    auVar214._4_4_ =
                         (uint)bVar58 * auVar163._4_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x204);
                    bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
                    auVar214._8_4_ =
                         (uint)bVar58 * auVar163._8_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x208);
                    bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
                    auVar214._12_4_ =
                         (uint)bVar58 * auVar163._12_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x20c);
                    bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
                    auVar214._16_4_ =
                         (uint)bVar58 * auVar163._16_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x210);
                    bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
                    auVar214._20_4_ =
                         (uint)bVar58 * auVar163._20_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x214);
                    bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
                    auVar214._24_4_ =
                         (uint)bVar58 * auVar163._24_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x218);
                    bVar58 = (bool)((byte)(uVar61 >> 7) & 1);
                    auVar214._28_4_ =
                         (uint)bVar58 * auVar163._28_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x21c);
                    bVar58 = (bool)((byte)(uVar61 >> 8) & 1);
                    auVar214._32_4_ =
                         (uint)bVar58 * auVar163._32_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x220);
                    bVar58 = (bool)((byte)(uVar61 >> 9) & 1);
                    auVar214._36_4_ =
                         (uint)bVar58 * auVar163._36_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x224);
                    bVar58 = (bool)((byte)(uVar61 >> 10) & 1);
                    auVar214._40_4_ =
                         (uint)bVar58 * auVar163._40_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x228);
                    bVar58 = (bool)((byte)(uVar61 >> 0xb) & 1);
                    auVar214._44_4_ =
                         (uint)bVar58 * auVar163._44_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x22c);
                    bVar58 = (bool)((byte)(uVar61 >> 0xc) & 1);
                    auVar214._48_4_ =
                         (uint)bVar58 * auVar163._48_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x230);
                    bVar58 = (bool)((byte)(uVar61 >> 0xd) & 1);
                    auVar214._52_4_ =
                         (uint)bVar58 * auVar163._52_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x234);
                    bVar58 = (bool)((byte)(uVar61 >> 0xe) & 1);
                    auVar214._56_4_ =
                         (uint)bVar58 * auVar163._56_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x238);
                    bVar58 = SUB81(uVar61 >> 0xf,0);
                    auVar214._60_4_ =
                         (uint)bVar58 * auVar163._60_4_ |
                         (uint)!bVar58 * *(int *)(local_9d0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9d0.ray + 0x200) = auVar214;
                    bVar56 = (short)uVar61 != 0;
                  }
                  if ((bool)bVar56 == false) {
                    *(float *)(ray + k * 4 + 0x200) = fVar234;
                  }
                }
                bVar58 = false;
              }
              auVar122 = auVar214._32_32_;
              if (!bVar58) goto LAB_01b5cbf6;
              lVar57 = lVar57 + -1;
            } while (lVar57 != 0);
            bVar56 = 0;
LAB_01b5cbf6:
            bVar55 = bVar55 | bVar56 & 1;
            auVar44._4_4_ = fStack_73c;
            auVar44._0_4_ = local_740;
            auVar44._8_4_ = fStack_738;
            auVar44._12_4_ = fStack_734;
            auVar44._16_4_ = fStack_730;
            auVar44._20_4_ = fStack_72c;
            auVar44._24_4_ = fStack_728;
            auVar44._28_4_ = fStack_724;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar29._4_4_ = uVar1;
            auVar29._0_4_ = uVar1;
            auVar29._8_4_ = uVar1;
            auVar29._12_4_ = uVar1;
            auVar29._16_4_ = uVar1;
            auVar29._20_4_ = uVar1;
            auVar29._24_4_ = uVar1;
            auVar29._28_4_ = uVar1;
            uVar14 = vcmpps_avx512vl(auVar44,auVar29,2);
            bVar52 = bVar47 & bVar52 & (byte)uVar14;
          } while (bVar52 != 0);
        }
        auVar159._0_4_ = (float)local_7e0._0_4_ + (float)local_760._0_4_;
        auVar159._4_4_ = (float)local_7e0._4_4_ + (float)local_760._4_4_;
        auVar159._8_4_ = fStack_7d8 + fStack_758;
        auVar159._12_4_ = fStack_7d4 + fStack_754;
        auVar159._16_4_ = fStack_7d0 + fStack_750;
        auVar159._20_4_ = fStack_7cc + fStack_74c;
        auVar159._24_4_ = fStack_7c8 + fStack_748;
        auVar159._28_4_ = fStack_7c4 + fStack_744;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar30._4_4_ = uVar1;
        auVar30._0_4_ = uVar1;
        auVar30._8_4_ = uVar1;
        auVar30._12_4_ = uVar1;
        auVar30._16_4_ = uVar1;
        auVar30._20_4_ = uVar1;
        auVar30._24_4_ = uVar1;
        auVar30._28_4_ = uVar1;
        uVar14 = vcmpps_avx512vl(auVar159,auVar30,2);
        bVar53 = (byte)uVar13 | ~bVar53;
        bVar50 = (byte)uVar15 & bVar50 & (byte)uVar14;
        auVar160._8_4_ = 2;
        auVar160._0_8_ = 0x200000002;
        auVar160._12_4_ = 2;
        auVar160._16_4_ = 2;
        auVar160._20_4_ = 2;
        auVar160._24_4_ = 2;
        auVar160._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar86 = vpblendmd_avx512vl(auVar160,auVar31);
        local_760._0_4_ = (uint)(bVar53 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar58 = (bool)(bVar53 >> 1 & 1);
        local_760._4_4_ = (uint)bVar58 * auVar86._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar53 >> 2 & 1);
        fStack_758 = (float)((uint)bVar58 * auVar86._8_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)(bVar53 >> 3 & 1);
        fStack_754 = (float)((uint)bVar58 * auVar86._12_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)(bVar53 >> 4 & 1);
        fStack_750 = (float)((uint)bVar58 * auVar86._16_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)(bVar53 >> 5 & 1);
        fStack_74c = (float)((uint)bVar58 * auVar86._20_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)(bVar53 >> 6 & 1);
        fStack_748 = (float)((uint)bVar58 * auVar86._24_4_ | (uint)!bVar58 * 2);
        fStack_744 = (float)((uint)(bVar53 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2);
        auVar134._32_32_ = auVar122;
        auVar134._0_32_ = _local_760;
        uVar13 = vpcmpd_avx512vl(_local_760,local_6c0,2);
        bVar53 = (byte)uVar13 & bVar50;
        if (bVar53 == 0) {
          auVar134._0_32_ = local_9a0;
          auVar264 = ZEXT3264(local_9a0);
        }
        else {
          auVar67 = vminps_avx(local_900._0_16_,local_940._0_16_);
          auVar63 = vmaxps_avx(local_900._0_16_,local_940._0_16_);
          auVar75 = vminps_avx(local_920._0_16_,local_960._0_16_);
          auVar64 = vminps_avx(auVar67,auVar75);
          auVar67 = vmaxps_avx(local_920._0_16_,local_960._0_16_);
          auVar75 = vmaxps_avx(auVar63,auVar67);
          auVar63 = vandps_avx(auVar247._0_16_,auVar64);
          auVar67 = vandps_avx(auVar247._0_16_,auVar75);
          auVar63 = vmaxps_avx(auVar63,auVar67);
          auVar67 = vmovshdup_avx(auVar63);
          auVar67 = vmaxss_avx(auVar67,auVar63);
          auVar63 = vshufpd_avx(auVar63,auVar63,1);
          auVar63 = vmaxss_avx(auVar63,auVar67);
          fVar225 = auVar63._0_4_ * 1.9073486e-06;
          local_8d0 = vshufps_avx(auVar75,auVar75,0xff);
          _local_860 = _local_660;
          local_740 = (float)local_7e0._0_4_ + (float)local_660._0_4_;
          fStack_73c = (float)local_7e0._4_4_ + (float)local_660._4_4_;
          fStack_738 = fStack_7d8 + fStack_658;
          fStack_734 = fStack_7d4 + fStack_654;
          fStack_730 = fStack_7d0 + fStack_650;
          fStack_72c = fStack_7cc + fStack_64c;
          fStack_728 = fStack_7c8 + fStack_648;
          fStack_724 = fStack_7c4 + fStack_644;
          do {
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar122 = vblendmps_avx512vl(auVar161,_local_860);
            auVar124._0_4_ =
                 (uint)(bVar53 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 1 & 1);
            auVar124._4_4_ = (uint)bVar58 * auVar122._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 2 & 1);
            auVar124._8_4_ = (uint)bVar58 * auVar122._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 3 & 1);
            auVar124._12_4_ = (uint)bVar58 * auVar122._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 4 & 1);
            auVar124._16_4_ = (uint)bVar58 * auVar122._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 5 & 1);
            auVar124._20_4_ = (uint)bVar58 * auVar122._20_4_ | (uint)!bVar58 * 0x7f800000;
            auVar124._24_4_ =
                 (uint)(bVar53 >> 6) * auVar122._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
            auVar124._28_4_ = 0x7f800000;
            auVar134._0_32_ = auVar124;
            auVar122 = vshufps_avx(auVar124,auVar124,0xb1);
            auVar122 = vminps_avx(auVar124,auVar122);
            auVar86 = vshufpd_avx(auVar122,auVar122,5);
            auVar122 = vminps_avx(auVar122,auVar86);
            auVar86 = vpermpd_avx2(auVar122,0x4e);
            auVar122 = vminps_avx(auVar122,auVar86);
            uVar13 = vcmpps_avx512vl(auVar124,auVar122,0);
            bVar56 = (byte)uVar13 & bVar53;
            bVar52 = bVar53;
            if (bVar56 != 0) {
              bVar52 = bVar56;
            }
            iVar16 = 0;
            for (uVar62 = (uint)bVar52; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            bVar52 = '\x01' << ((byte)iVar16 & 0x1f);
            uVar62 = *(uint *)(local_720 + (uint)(iVar16 << 2));
            fVar231 = *(float *)(local_640 + (uint)(iVar16 << 2));
            fVar232 = auVar68._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              fVar232 = sqrtf((float)local_980._0_4_);
            }
            auVar250 = ZEXT464(uVar62);
            bVar56 = ~bVar52;
            lVar57 = 5;
            do {
              auVar122 = auVar134._32_32_;
              auVar149._4_4_ = fVar231;
              auVar149._0_4_ = fVar231;
              auVar149._8_4_ = fVar231;
              auVar149._12_4_ = fVar231;
              auVar63 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_970);
              fVar249 = auVar250._0_4_;
              fVar236 = 1.0 - fVar249;
              auVar69 = SUB6416(ZEXT464(0x40400000),0);
              auVar240 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar65 = auVar250._0_16_;
              auVar75 = vfmadd213ss_fma(auVar69,auVar65,auVar240);
              auVar67 = vfmadd213ss_fma(auVar75,ZEXT416((uint)(fVar249 * fVar249)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar64 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar236),auVar240);
              auVar64 = vfmadd213ss_fma(auVar64,ZEXT416((uint)(fVar236 * fVar236)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar233 = fVar236 * fVar236 * -fVar249 * 0.5;
              fVar234 = auVar67._0_4_ * 0.5;
              fVar235 = auVar64._0_4_ * 0.5;
              fVar254 = fVar249 * fVar249 * -fVar236 * 0.5;
              auVar207._0_4_ = fVar254 * (float)local_960._0_4_;
              auVar207._4_4_ = fVar254 * (float)local_960._4_4_;
              auVar207._8_4_ = fVar254 * fStack_958;
              auVar207._12_4_ = fVar254 * fStack_954;
              auVar218._4_4_ = fVar235;
              auVar218._0_4_ = fVar235;
              auVar218._8_4_ = fVar235;
              auVar218._12_4_ = fVar235;
              auVar67 = vfmadd132ps_fma(auVar218,auVar207,local_920._0_16_);
              auVar193._4_4_ = fVar234;
              auVar193._0_4_ = fVar234;
              auVar193._8_4_ = fVar234;
              auVar193._12_4_ = fVar234;
              auVar67 = vfmadd132ps_fma(auVar193,auVar67,local_940._0_16_);
              auVar208._4_4_ = fVar233;
              auVar208._0_4_ = fVar233;
              auVar208._8_4_ = fVar233;
              auVar208._12_4_ = fVar233;
              auVar67 = vfmadd132ps_fma(auVar208,auVar67,local_900._0_16_);
              auVar64 = vfmadd231ss_fma(auVar240,auVar65,ZEXT416(0x41100000));
              local_840._0_16_ = auVar64;
              local_870 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar65,ZEXT416(0x40800000)
                                         );
              local_880 = vfmadd213ss_fma(auVar69,auVar65,ZEXT416(0xbf800000));
              local_820._0_16_ = auVar67;
              auVar67 = vsubps_avx(auVar63,auVar67);
              auVar63 = vdpps_avx(auVar67,auVar67,0x7f);
              fVar233 = auVar63._0_4_;
              if (fVar233 < 0.0) {
                auVar257._0_4_ = sqrtf(fVar233);
                auVar257._4_60_ = extraout_var_00;
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar64 = auVar257._0_16_;
              }
              else {
                auVar64 = vsqrtss_avx(auVar63,auVar63);
              }
              auVar70 = vfnmadd231ss_fma(ZEXT416((uint)(fVar249 * (fVar236 + fVar236))),
                                         ZEXT416((uint)fVar236),ZEXT416((uint)fVar236));
              auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)(fVar249 + fVar249)),
                                        ZEXT416((uint)(fVar249 * fVar249 * 3.0)));
              auVar240 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar65,
                                         SUB6416(ZEXT464(0x40000000),0));
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar236 * -3.0)),
                                        ZEXT416((uint)(fVar236 + fVar236)),auVar240);
              auVar240 = vfmadd213ss_fma(ZEXT416((uint)(fVar236 * -2.0)),auVar65,
                                         ZEXT416((uint)(fVar249 * fVar249)));
              fVar234 = auVar70._0_4_ * 0.5;
              fVar235 = auVar75._0_4_ * 0.5;
              fVar254 = auVar69._0_4_ * 0.5;
              fVar236 = auVar240._0_4_ * 0.5;
              auVar209._0_4_ = fVar236 * (float)local_960._0_4_;
              auVar209._4_4_ = fVar236 * (float)local_960._4_4_;
              auVar209._8_4_ = fVar236 * fStack_958;
              auVar209._12_4_ = fVar236 * fStack_954;
              auVar194._4_4_ = fVar254;
              auVar194._0_4_ = fVar254;
              auVar194._8_4_ = fVar254;
              auVar194._12_4_ = fVar254;
              auVar75 = vfmadd132ps_fma(auVar194,auVar209,local_920._0_16_);
              auVar174._4_4_ = fVar235;
              auVar174._0_4_ = fVar235;
              auVar174._8_4_ = fVar235;
              auVar174._12_4_ = fVar235;
              auVar75 = vfmadd132ps_fma(auVar174,auVar75,local_940._0_16_);
              auVar263._4_4_ = fVar234;
              auVar263._0_4_ = fVar234;
              auVar263._8_4_ = fVar234;
              auVar263._12_4_ = fVar234;
              auVar240 = vfmadd132ps_fma(auVar263,auVar75,local_900._0_16_);
              auVar75 = vdpps_avx(auVar240,auVar240,0x7f);
              auVar43._12_4_ = 0;
              auVar43._0_12_ = ZEXT812(0);
              fVar234 = auVar75._0_4_;
              auVar69 = vrsqrt14ss_avx512f(auVar43 << 0x20,ZEXT416((uint)fVar234));
              fVar235 = auVar69._0_4_;
              auVar70 = vrcp14ss_avx512f(auVar43 << 0x20,ZEXT416((uint)fVar234));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar71 = vxorps_avx512vl(auVar75,auVar20);
              auVar69 = vfnmadd213ss_fma(auVar70,auVar75,SUB6416(ZEXT464(0x40000000),0));
              uVar62 = auVar64._0_4_;
              if (fVar234 < auVar71._0_4_) {
                fVar254 = sqrtf(fVar234);
                auVar64 = ZEXT416(uVar62);
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                fVar254 = auVar75._0_4_;
              }
              fVar235 = fVar235 * 1.5 + fVar234 * -0.5 * fVar235 * fVar235 * fVar235;
              auVar150._0_4_ = auVar240._0_4_ * fVar235;
              auVar150._4_4_ = auVar240._4_4_ * fVar235;
              auVar150._8_4_ = auVar240._8_4_ * fVar235;
              auVar150._12_4_ = auVar240._12_4_ * fVar235;
              auVar75 = vdpps_avx(auVar67,auVar150,0x7f);
              fVar237 = auVar64._0_4_;
              auVar151._0_4_ = auVar75._0_4_ * auVar75._0_4_;
              auVar151._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar151._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar151._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar72 = vsubps_avx512vl(auVar63,auVar151);
              fVar236 = auVar72._0_4_;
              auVar175._4_12_ = ZEXT812(0) << 0x20;
              auVar175._0_4_ = fVar236;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
              auVar73 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              if (fVar236 < 0.0) {
                local_8b0 = fVar235;
                fStack_8ac = fVar235;
                fStack_8a8 = fVar235;
                fStack_8a4 = fVar235;
                local_8a0 = auVar71;
                local_890 = auVar75;
                fVar142 = sqrtf(fVar236);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar64 = ZEXT416(uVar62);
                auVar75 = local_890;
                auVar71 = local_8a0;
                fVar235 = local_8b0;
                fVar243 = fStack_8ac;
                fVar244 = fStack_8a8;
                fVar248 = fStack_8a4;
              }
              else {
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                fVar142 = auVar72._0_4_;
                fVar243 = fVar235;
                fVar244 = fVar235;
                fVar248 = fVar235;
              }
              auVar257 = ZEXT1664(auVar67);
              auVar246._8_4_ = 0x7fffffff;
              auVar246._0_8_ = 0x7fffffff7fffffff;
              auVar246._12_4_ = 0x7fffffff;
              auVar247 = ZEXT1664(auVar246);
              auVar264 = ZEXT3264(local_9a0);
              auVar131._32_32_ = auVar122;
              auVar131._0_32_ = auVar127._0_32_;
              auVar176._0_4_ = (float)local_880._0_4_ * (float)local_960._0_4_;
              auVar176._4_4_ = (float)local_880._0_4_ * (float)local_960._4_4_;
              auVar176._8_4_ = (float)local_880._0_4_ * fStack_958;
              auVar176._12_4_ = (float)local_880._0_4_ * fStack_954;
              auVar195._4_4_ = local_870._0_4_;
              auVar195._0_4_ = local_870._0_4_;
              auVar195._8_4_ = local_870._0_4_;
              auVar195._12_4_ = local_870._0_4_;
              auVar72 = vfmadd132ps_fma(auVar195,auVar176,local_920._0_16_);
              auVar177._4_4_ = local_840._0_4_;
              auVar177._0_4_ = local_840._0_4_;
              auVar177._8_4_ = local_840._0_4_;
              auVar177._12_4_ = local_840._0_4_;
              auVar72 = vfmadd132ps_fma(auVar177,auVar72,local_940._0_16_);
              auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar65,ZEXT416(0x40000000));
              auVar196._0_4_ = auVar65._0_4_;
              auVar196._4_4_ = auVar196._0_4_;
              auVar196._8_4_ = auVar196._0_4_;
              auVar196._12_4_ = auVar196._0_4_;
              auVar65 = vfmadd132ps_fma(auVar196,auVar72,local_900._0_16_);
              auVar178._0_4_ = auVar65._0_4_ * fVar234;
              auVar178._4_4_ = auVar65._4_4_ * fVar234;
              auVar178._8_4_ = auVar65._8_4_ * fVar234;
              auVar178._12_4_ = auVar65._12_4_ * fVar234;
              auVar65 = vdpps_avx(auVar240,auVar65,0x7f);
              fVar234 = auVar65._0_4_;
              auVar197._0_4_ = auVar240._0_4_ * fVar234;
              auVar197._4_4_ = auVar240._4_4_ * fVar234;
              auVar197._8_4_ = auVar240._8_4_ * fVar234;
              auVar197._12_4_ = auVar240._12_4_ * fVar234;
              auVar65 = vsubps_avx(auVar178,auVar197);
              local_bf0 = auVar70._0_4_;
              local_bf0 = auVar69._0_4_ * local_bf0;
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar225),
                                   ZEXT416((uint)(fVar231 * fVar232 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar134._16_48_ = auVar131._16_48_;
              auVar74 = vxorps_avx512vl(auVar240,auVar21);
              auVar198._0_4_ = fVar235 * auVar65._0_4_ * local_bf0;
              auVar198._4_4_ = fVar243 * auVar65._4_4_ * local_bf0;
              auVar198._8_4_ = fVar244 * auVar65._8_4_ * local_bf0;
              auVar198._12_4_ = fVar248 * auVar65._12_4_ * local_bf0;
              auVar69 = vdpps_avx(auVar74,auVar150,0x7f);
              auVar65 = vfmadd213ss_fma(auVar64,ZEXT416((uint)fVar225),auVar70);
              auVar64 = vdpps_avx(auVar67,auVar198,0x7f);
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),
                                        ZEXT416((uint)(fVar225 / fVar254)),auVar65);
              fVar234 = auVar69._0_4_ + auVar64._0_4_;
              auVar64 = vdpps_avx(local_970,auVar150,0x7f);
              auVar69 = vdpps_avx(auVar67,auVar74,0x7f);
              auVar65 = vmulss_avx512f(auVar71,ZEXT416((uint)(fVar236 * -0.5)));
              auVar71 = vmulss_avx512f(auVar71,auVar71);
              auVar134._0_16_ =
                   vaddss_avx512f(auVar73,ZEXT416((uint)(auVar65._0_4_ * auVar71._0_4_)));
              auVar65 = vdpps_avx(auVar67,local_970,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar69,auVar75,ZEXT416((uint)fVar234));
              auVar73 = vfnmadd231ss_fma(auVar65,auVar75,auVar64);
              auVar69 = vpermilps_avx(local_820._0_16_,0xff);
              fVar142 = fVar142 - auVar69._0_4_;
              auVar69 = vshufps_avx(auVar240,auVar240,0xff);
              auVar65 = vfmsub213ss_fma(auVar71,auVar134._0_16_,auVar69);
              fVar235 = auVar73._0_4_ * auVar134._0_4_;
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar65._0_4_)),
                                        ZEXT416((uint)fVar234),ZEXT416((uint)fVar235));
              fVar254 = auVar71._0_4_;
              fVar249 = fVar249 - (auVar75._0_4_ * (fVar235 / fVar254) -
                                  fVar142 * (auVar64._0_4_ / fVar254));
              auVar250 = ZEXT464((uint)fVar249);
              fVar231 = fVar231 - (fVar142 * (fVar234 / fVar254) -
                                  auVar75._0_4_ * (auVar65._0_4_ / fVar254));
              auVar75 = vandps_avx(auVar75,auVar246);
              bVar58 = true;
              if (auVar75._0_4_ < auVar72._0_4_) {
                auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ + auVar70._0_4_)),local_8d0,
                                          ZEXT416(0x36000000));
                auVar75 = vandps_avx(auVar246,ZEXT416((uint)fVar142));
                if (auVar75._0_4_ < auVar64._0_4_) {
                  fVar231 = fVar231 + (float)local_8c0._0_4_;
                  if ((((fVar164 <= fVar231) &&
                       (fVar234 = *(float *)(ray + k * 4 + 0x200), fVar231 <= fVar234)) &&
                      (0.0 <= fVar249)) && (fVar249 <= 1.0)) {
                    auVar133._16_48_ = auVar134._16_48_;
                    auVar133._0_16_ = ZEXT816(0) << 0x20;
                    auVar132._4_60_ = auVar133._4_60_;
                    auVar132._0_4_ = fVar233;
                    auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar132._0_16_);
                    fVar233 = auVar75._0_4_;
                    auVar134._0_16_ = vmulss_avx512f(auVar63,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar54].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar52 = true;
                      }
                      else {
                        fVar233 = fVar233 * 1.5 + auVar134._0_4_ * fVar233 * fVar233 * fVar233;
                        auVar179._0_4_ = auVar67._0_4_ * fVar233;
                        auVar179._4_4_ = auVar67._4_4_ * fVar233;
                        auVar179._8_4_ = auVar67._8_4_ * fVar233;
                        auVar179._12_4_ = auVar67._12_4_ * fVar233;
                        auVar69 = vfmadd213ps_fma(auVar69,auVar179,auVar240);
                        auVar63 = vshufps_avx(auVar179,auVar179,0xc9);
                        auVar75 = vshufps_avx(auVar240,auVar240,0xc9);
                        auVar180._0_4_ = auVar179._0_4_ * auVar75._0_4_;
                        auVar180._4_4_ = auVar179._4_4_ * auVar75._4_4_;
                        auVar180._8_4_ = auVar179._8_4_ * auVar75._8_4_;
                        auVar180._12_4_ = auVar179._12_4_ * auVar75._12_4_;
                        auVar64 = vfmsub231ps_fma(auVar180,auVar240,auVar63);
                        auVar63 = vshufps_avx(auVar64,auVar64,0xc9);
                        auVar75 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar64 = vshufps_avx(auVar64,auVar64,0xd2);
                        auVar152._0_4_ = auVar69._0_4_ * auVar64._0_4_;
                        auVar152._4_4_ = auVar69._4_4_ * auVar64._4_4_;
                        auVar152._8_4_ = auVar69._8_4_ * auVar64._8_4_;
                        auVar152._12_4_ = auVar69._12_4_ * auVar64._12_4_;
                        auVar63 = vfmsub231ps_fma(auVar152,auVar63,auVar75);
                        auVar75 = ZEXT416((uint)fVar249);
                        local_340 = vbroadcastss_avx512f(auVar75);
                        auVar163 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar163 = vpermps_avx512f(auVar163,ZEXT1664(auVar63));
                        auVar200 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar200,ZEXT1664(auVar63));
                        local_380 = vbroadcastss_avx512f(auVar63);
                        local_400[0] = (RTCHitN)auVar163[0];
                        local_400[1] = (RTCHitN)auVar163[1];
                        local_400[2] = (RTCHitN)auVar163[2];
                        local_400[3] = (RTCHitN)auVar163[3];
                        local_400[4] = (RTCHitN)auVar163[4];
                        local_400[5] = (RTCHitN)auVar163[5];
                        local_400[6] = (RTCHitN)auVar163[6];
                        local_400[7] = (RTCHitN)auVar163[7];
                        local_400[8] = (RTCHitN)auVar163[8];
                        local_400[9] = (RTCHitN)auVar163[9];
                        local_400[10] = (RTCHitN)auVar163[10];
                        local_400[0xb] = (RTCHitN)auVar163[0xb];
                        local_400[0xc] = (RTCHitN)auVar163[0xc];
                        local_400[0xd] = (RTCHitN)auVar163[0xd];
                        local_400[0xe] = (RTCHitN)auVar163[0xe];
                        local_400[0xf] = (RTCHitN)auVar163[0xf];
                        local_400[0x10] = (RTCHitN)auVar163[0x10];
                        local_400[0x11] = (RTCHitN)auVar163[0x11];
                        local_400[0x12] = (RTCHitN)auVar163[0x12];
                        local_400[0x13] = (RTCHitN)auVar163[0x13];
                        local_400[0x14] = (RTCHitN)auVar163[0x14];
                        local_400[0x15] = (RTCHitN)auVar163[0x15];
                        local_400[0x16] = (RTCHitN)auVar163[0x16];
                        local_400[0x17] = (RTCHitN)auVar163[0x17];
                        local_400[0x18] = (RTCHitN)auVar163[0x18];
                        local_400[0x19] = (RTCHitN)auVar163[0x19];
                        local_400[0x1a] = (RTCHitN)auVar163[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar163[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar163[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar163[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar163[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar163[0x1f];
                        local_400[0x20] = (RTCHitN)auVar163[0x20];
                        local_400[0x21] = (RTCHitN)auVar163[0x21];
                        local_400[0x22] = (RTCHitN)auVar163[0x22];
                        local_400[0x23] = (RTCHitN)auVar163[0x23];
                        local_400[0x24] = (RTCHitN)auVar163[0x24];
                        local_400[0x25] = (RTCHitN)auVar163[0x25];
                        local_400[0x26] = (RTCHitN)auVar163[0x26];
                        local_400[0x27] = (RTCHitN)auVar163[0x27];
                        local_400[0x28] = (RTCHitN)auVar163[0x28];
                        local_400[0x29] = (RTCHitN)auVar163[0x29];
                        local_400[0x2a] = (RTCHitN)auVar163[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar163[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar163[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar163[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar163[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar163[0x2f];
                        local_400[0x30] = (RTCHitN)auVar163[0x30];
                        local_400[0x31] = (RTCHitN)auVar163[0x31];
                        local_400[0x32] = (RTCHitN)auVar163[0x32];
                        local_400[0x33] = (RTCHitN)auVar163[0x33];
                        local_400[0x34] = (RTCHitN)auVar163[0x34];
                        local_400[0x35] = (RTCHitN)auVar163[0x35];
                        local_400[0x36] = (RTCHitN)auVar163[0x36];
                        local_400[0x37] = (RTCHitN)auVar163[0x37];
                        local_400[0x38] = (RTCHitN)auVar163[0x38];
                        local_400[0x39] = (RTCHitN)auVar163[0x39];
                        local_400[0x3a] = (RTCHitN)auVar163[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar163[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar163[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar163[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar163[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar163[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_440._0_8_;
                        uStack_2b8 = local_440._8_8_;
                        uStack_2b0 = local_440._16_8_;
                        uStack_2a8 = local_440._24_8_;
                        uStack_2a0 = local_440._32_8_;
                        uStack_298 = local_440._40_8_;
                        uStack_290 = local_440._48_8_;
                        uStack_288 = local_440._56_8_;
                        auVar163 = vmovdqa64_avx512f(local_480);
                        local_280 = vmovdqa64_avx512f(auVar163);
                        vpcmpeqd_avx2(auVar163._0_32_,auVar163._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar231;
                        local_7c0 = local_4c0;
                        local_9d0.valid = (int *)local_7c0;
                        local_9d0.geometryUserPtr = pGVar4->userPtr;
                        local_9d0.context = context->user;
                        local_9d0.hit = local_400;
                        local_9d0.N = 0x10;
                        local_9d0.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar247 = ZEXT1664(auVar246);
                          auVar257 = ZEXT1664(auVar67);
                          (*pGVar4->occlusionFilterN)(&local_9d0);
                          auVar250 = ZEXT1664(auVar75);
                          auVar264 = ZEXT3264(local_9a0);
                        }
                        auVar134 = vmovdqa64_avx512f(local_7c0);
                        uVar13 = vptestmd_avx512f(auVar134,auVar134);
                        if ((short)uVar13 == 0) {
                          bVar52 = false;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar247 = ZEXT1664(auVar247._0_16_);
                            auVar257 = ZEXT1664(auVar257._0_16_);
                            (*p_Var5)(&local_9d0);
                            auVar250 = ZEXT1664(auVar75);
                            auVar264 = ZEXT3264(local_9a0);
                          }
                          auVar163 = vmovdqa64_avx512f(local_7c0);
                          uVar61 = vptestmd_avx512f(auVar163,auVar163);
                          auVar163 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar58 = (bool)((byte)uVar61 & 1);
                          auVar134._0_4_ =
                               (uint)bVar58 * auVar163._0_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x200);
                          bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
                          auVar134._4_4_ =
                               (uint)bVar58 * auVar163._4_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x204);
                          bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
                          auVar134._8_4_ =
                               (uint)bVar58 * auVar163._8_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x208);
                          bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
                          auVar134._12_4_ =
                               (uint)bVar58 * auVar163._12_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x20c);
                          bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
                          auVar134._16_4_ =
                               (uint)bVar58 * auVar163._16_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x210);
                          bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
                          auVar134._20_4_ =
                               (uint)bVar58 * auVar163._20_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x214);
                          bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
                          auVar134._24_4_ =
                               (uint)bVar58 * auVar163._24_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x218);
                          bVar58 = (bool)((byte)(uVar61 >> 7) & 1);
                          auVar134._28_4_ =
                               (uint)bVar58 * auVar163._28_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x21c);
                          bVar58 = (bool)((byte)(uVar61 >> 8) & 1);
                          auVar134._32_4_ =
                               (uint)bVar58 * auVar163._32_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x220);
                          bVar58 = (bool)((byte)(uVar61 >> 9) & 1);
                          auVar134._36_4_ =
                               (uint)bVar58 * auVar163._36_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x224);
                          bVar58 = (bool)((byte)(uVar61 >> 10) & 1);
                          auVar134._40_4_ =
                               (uint)bVar58 * auVar163._40_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x228);
                          bVar58 = (bool)((byte)(uVar61 >> 0xb) & 1);
                          auVar134._44_4_ =
                               (uint)bVar58 * auVar163._44_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x22c);
                          bVar58 = (bool)((byte)(uVar61 >> 0xc) & 1);
                          auVar134._48_4_ =
                               (uint)bVar58 * auVar163._48_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x230);
                          bVar58 = (bool)((byte)(uVar61 >> 0xd) & 1);
                          auVar134._52_4_ =
                               (uint)bVar58 * auVar163._52_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x234);
                          bVar58 = (bool)((byte)(uVar61 >> 0xe) & 1);
                          auVar134._56_4_ =
                               (uint)bVar58 * auVar163._56_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x238);
                          bVar58 = SUB81(uVar61 >> 0xf,0);
                          auVar134._60_4_ =
                               (uint)bVar58 * auVar163._60_4_ |
                               (uint)!bVar58 * *(int *)(local_9d0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_9d0.ray + 0x200) = auVar134;
                          bVar52 = (short)uVar61 != 0;
                        }
                        if ((bool)bVar52 == false) {
                          *(float *)(ray + k * 4 + 0x200) = fVar234;
                        }
                      }
                      bVar58 = false;
                      goto LAB_01b5d49f;
                    }
                  }
                  bVar58 = false;
                  bVar52 = 0;
                }
              }
LAB_01b5d49f:
              if (!bVar58) goto LAB_01b5d86d;
              lVar57 = lVar57 + -1;
            } while (lVar57 != 0);
            bVar52 = 0;
LAB_01b5d86d:
            bVar55 = bVar55 | bVar52 & 1;
            auVar45._4_4_ = fStack_73c;
            auVar45._0_4_ = local_740;
            auVar45._8_4_ = fStack_738;
            auVar45._12_4_ = fStack_734;
            auVar45._16_4_ = fStack_730;
            auVar45._20_4_ = fStack_72c;
            auVar45._24_4_ = fStack_728;
            auVar45._28_4_ = fStack_724;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar32._4_4_ = uVar1;
            auVar32._0_4_ = uVar1;
            auVar32._8_4_ = uVar1;
            auVar32._12_4_ = uVar1;
            auVar32._16_4_ = uVar1;
            auVar32._20_4_ = uVar1;
            auVar32._24_4_ = uVar1;
            auVar32._28_4_ = uVar1;
            uVar13 = vcmpps_avx512vl(auVar45,auVar32,2);
            bVar53 = bVar56 & bVar53 & (byte)uVar13;
          } while (bVar53 != 0);
        }
        uVar14 = vpcmpd_avx512vl(local_6c0,_local_760,1);
        uVar15 = vpcmpd_avx512vl(local_6c0,local_620,1);
        auVar181._0_4_ = (float)local_7e0._0_4_ + (float)local_500._0_4_;
        auVar181._4_4_ = (float)local_7e0._4_4_ + (float)local_500._4_4_;
        auVar181._8_4_ = fStack_7d8 + fStack_4f8;
        auVar181._12_4_ = fStack_7d4 + fStack_4f4;
        auVar181._16_4_ = fStack_7d0 + fStack_4f0;
        auVar181._20_4_ = fStack_7cc + fStack_4ec;
        auVar181._24_4_ = fStack_7c8 + fStack_4e8;
        auVar181._28_4_ = fStack_7c4 + fStack_4e4;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar199._4_4_ = uVar1;
        auVar199._0_4_ = uVar1;
        auVar199._8_4_ = uVar1;
        auVar199._12_4_ = uVar1;
        auVar199._16_4_ = uVar1;
        auVar199._20_4_ = uVar1;
        auVar199._24_4_ = uVar1;
        auVar199._28_4_ = uVar1;
        uVar13 = vcmpps_avx512vl(auVar181,auVar199,2);
        bVar49 = bVar49 & (byte)uVar15 & (byte)uVar13;
        auVar213._0_4_ = (float)local_7e0._0_4_ + local_660._0_4_;
        auVar213._4_4_ = (float)local_7e0._4_4_ + local_660._4_4_;
        auVar213._8_4_ = fStack_7d8 + local_660._8_4_;
        auVar213._12_4_ = fStack_7d4 + local_660._12_4_;
        auVar213._16_4_ = fStack_7d0 + local_660._16_4_;
        auVar213._20_4_ = fStack_7cc + local_660._20_4_;
        auVar213._24_4_ = fStack_7c8 + local_660._24_4_;
        auVar213._28_4_ = fStack_7c4 + local_660._28_4_;
        uVar13 = vcmpps_avx512vl(auVar213,auVar199,2);
        bVar50 = bVar50 & (byte)uVar14 & (byte)uVar13 | bVar49;
        if (bVar50 != 0) {
          local_1a0[uVar48 * 0x60] = bVar50;
          auVar125._0_4_ =
               (uint)(bVar49 & 1) * local_500._0_4_ |
               (uint)!(bool)(bVar49 & 1) * (int)local_660._0_4_;
          bVar58 = (bool)(bVar49 >> 1 & 1);
          auVar125._4_4_ = (uint)bVar58 * local_500._4_4_ | (uint)!bVar58 * (int)local_660._4_4_;
          bVar58 = (bool)(bVar49 >> 2 & 1);
          auVar125._8_4_ = (uint)bVar58 * (int)fStack_4f8 | (uint)!bVar58 * (int)local_660._8_4_;
          bVar58 = (bool)(bVar49 >> 3 & 1);
          auVar125._12_4_ = (uint)bVar58 * (int)fStack_4f4 | (uint)!bVar58 * (int)local_660._12_4_;
          bVar58 = (bool)(bVar49 >> 4 & 1);
          auVar125._16_4_ = (uint)bVar58 * (int)fStack_4f0 | (uint)!bVar58 * (int)local_660._16_4_;
          bVar58 = (bool)(bVar49 >> 5 & 1);
          auVar125._20_4_ = (uint)bVar58 * (int)fStack_4ec | (uint)!bVar58 * (int)local_660._20_4_;
          auVar125._24_4_ =
               (uint)(bVar49 >> 6) * (int)fStack_4e8 |
               (uint)!(bool)(bVar49 >> 6) * (int)local_660._24_4_;
          auVar125._28_4_ = local_660._28_4_;
          auVar134._0_32_ = auVar125;
          *(undefined1 (*) [32])(auStack_180 + uVar48 * 0x60) = auVar125;
          uVar13 = vmovlps_avx(local_8e0);
          *(undefined8 *)(local_160 + uVar48 * 0x18) = uVar13;
          local_158[uVar48 * 0x18] = iVar3 + 1;
          uVar48 = (ulong)((int)uVar48 + 1);
        }
      }
      auVar214 = ZEXT3264(_DAT_02020f20);
      auVar200 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    do {
      if ((int)uVar48 == 0) {
        if (bVar55 != 0) {
          return bVar59;
        }
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar22._4_4_ = uVar1;
        auVar22._0_4_ = uVar1;
        auVar22._8_4_ = uVar1;
        auVar22._12_4_ = uVar1;
        uVar13 = vcmpps_avx512vl(local_6d0,auVar22,2);
        uVar54 = (uint)uVar60 & (uint)uVar13;
        uVar60 = (ulong)uVar54;
        bVar59 = uVar54 != 0;
        if (!bVar59) {
          return bVar59;
        }
        goto LAB_01b5b05e;
      }
      uVar61 = (ulong)((int)uVar48 - 1);
      lVar57 = uVar61 * 0x60;
      auVar122 = *(undefined1 (*) [32])(auStack_180 + lVar57);
      auVar182._0_4_ = auVar122._0_4_ + (float)local_7e0._0_4_;
      auVar182._4_4_ = auVar122._4_4_ + (float)local_7e0._4_4_;
      auVar182._8_4_ = auVar122._8_4_ + fStack_7d8;
      auVar182._12_4_ = auVar122._12_4_ + fStack_7d4;
      auVar182._16_4_ = auVar122._16_4_ + fStack_7d0;
      auVar182._20_4_ = auVar122._20_4_ + fStack_7cc;
      auVar182._24_4_ = auVar122._24_4_ + fStack_7c8;
      auVar182._28_4_ = auVar122._28_4_ + fStack_7c4;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar33._4_4_ = uVar1;
      auVar33._0_4_ = uVar1;
      auVar33._8_4_ = uVar1;
      auVar33._12_4_ = uVar1;
      auVar33._16_4_ = uVar1;
      auVar33._20_4_ = uVar1;
      auVar33._24_4_ = uVar1;
      auVar33._28_4_ = uVar1;
      uVar13 = vcmpps_avx512vl(auVar182,auVar33,2);
      uVar62 = (uint)uVar13 & (uint)local_1a0[lVar57];
      bVar50 = (byte)uVar62;
      if (uVar62 != 0) {
        auVar183._8_4_ = 0x7f800000;
        auVar183._0_8_ = 0x7f8000007f800000;
        auVar183._12_4_ = 0x7f800000;
        auVar183._16_4_ = 0x7f800000;
        auVar183._20_4_ = 0x7f800000;
        auVar183._24_4_ = 0x7f800000;
        auVar183._28_4_ = 0x7f800000;
        auVar86 = vblendmps_avx512vl(auVar183,auVar122);
        auVar126._0_4_ =
             (uint)(bVar50 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar50 & 1) * (int)auVar122._0_4_;
        bVar58 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar58 * auVar86._4_4_ | (uint)!bVar58 * (int)auVar122._4_4_;
        bVar58 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar58 * auVar86._8_4_ | (uint)!bVar58 * (int)auVar122._8_4_;
        bVar58 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar58 * auVar86._12_4_ | (uint)!bVar58 * (int)auVar122._12_4_;
        bVar58 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar58 * auVar86._16_4_ | (uint)!bVar58 * (int)auVar122._16_4_;
        bVar58 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar58 * auVar86._20_4_ | (uint)!bVar58 * (int)auVar122._20_4_;
        bVar58 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar58 * auVar86._24_4_ | (uint)!bVar58 * (int)auVar122._24_4_;
        auVar126._28_4_ =
             (uVar62 >> 7) * auVar86._28_4_ | (uint)!SUB41(uVar62 >> 7,0) * (int)auVar122._28_4_;
        auVar134._0_32_ = auVar126;
        auVar122 = vshufps_avx(auVar126,auVar126,0xb1);
        auVar122 = vminps_avx(auVar126,auVar122);
        auVar86 = vshufpd_avx(auVar122,auVar122,5);
        auVar122 = vminps_avx(auVar122,auVar86);
        auVar86 = vpermpd_avx2(auVar122,0x4e);
        auVar122 = vminps_avx(auVar122,auVar86);
        uVar13 = vcmpps_avx512vl(auVar126,auVar122,0);
        bVar53 = (byte)uVar13 & bVar50;
        if (bVar53 != 0) {
          uVar62 = (uint)bVar53;
        }
        fVar225 = local_160[uVar61 * 0x18 + 1];
        uVar135 = 0;
        for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
          uVar135 = uVar135 + 1;
        }
        iVar3 = local_158[uVar61 * 0x18];
        bVar53 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar50;
        local_1a0[lVar57] = bVar53;
        auVar200 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        uVar51 = uVar61;
        if (bVar53 != 0) {
          uVar51 = uVar48;
        }
        fVar231 = local_160[uVar61 * 0x18];
        auVar184._4_4_ = fVar231;
        auVar184._0_4_ = fVar231;
        auVar184._8_4_ = fVar231;
        auVar184._12_4_ = fVar231;
        auVar184._16_4_ = fVar231;
        auVar184._20_4_ = fVar231;
        auVar184._24_4_ = fVar231;
        auVar184._28_4_ = fVar231;
        fVar225 = fVar225 - fVar231;
        auVar162._4_4_ = fVar225;
        auVar162._0_4_ = fVar225;
        auVar162._8_4_ = fVar225;
        auVar162._12_4_ = fVar225;
        auVar162._16_4_ = fVar225;
        auVar162._20_4_ = fVar225;
        auVar162._24_4_ = fVar225;
        auVar162._28_4_ = fVar225;
        auVar63 = vfmadd132ps_fma(auVar162,auVar184,auVar214._0_32_);
        auVar122 = ZEXT1632(auVar63);
        local_400[0] = (RTCHitN)auVar122[0];
        local_400[1] = (RTCHitN)auVar122[1];
        local_400[2] = (RTCHitN)auVar122[2];
        local_400[3] = (RTCHitN)auVar122[3];
        local_400[4] = (RTCHitN)auVar122[4];
        local_400[5] = (RTCHitN)auVar122[5];
        local_400[6] = (RTCHitN)auVar122[6];
        local_400[7] = (RTCHitN)auVar122[7];
        local_400[8] = (RTCHitN)auVar122[8];
        local_400[9] = (RTCHitN)auVar122[9];
        local_400[10] = (RTCHitN)auVar122[10];
        local_400[0xb] = (RTCHitN)auVar122[0xb];
        local_400[0xc] = (RTCHitN)auVar122[0xc];
        local_400[0xd] = (RTCHitN)auVar122[0xd];
        local_400[0xe] = (RTCHitN)auVar122[0xe];
        local_400[0xf] = (RTCHitN)auVar122[0xf];
        local_400[0x10] = (RTCHitN)auVar122[0x10];
        local_400[0x11] = (RTCHitN)auVar122[0x11];
        local_400[0x12] = (RTCHitN)auVar122[0x12];
        local_400[0x13] = (RTCHitN)auVar122[0x13];
        local_400[0x14] = (RTCHitN)auVar122[0x14];
        local_400[0x15] = (RTCHitN)auVar122[0x15];
        local_400[0x16] = (RTCHitN)auVar122[0x16];
        local_400[0x17] = (RTCHitN)auVar122[0x17];
        local_400[0x18] = (RTCHitN)auVar122[0x18];
        local_400[0x19] = (RTCHitN)auVar122[0x19];
        local_400[0x1a] = (RTCHitN)auVar122[0x1a];
        local_400[0x1b] = (RTCHitN)auVar122[0x1b];
        local_400[0x1c] = (RTCHitN)auVar122[0x1c];
        local_400[0x1d] = (RTCHitN)auVar122[0x1d];
        local_400[0x1e] = (RTCHitN)auVar122[0x1e];
        local_400[0x1f] = (RTCHitN)auVar122[0x1f];
        local_8e0._8_8_ = 0;
        local_8e0._0_8_ = *(ulong *)(local_400 + (ulong)uVar135 * 4);
        uVar61 = uVar51;
      }
      uVar48 = uVar61;
    } while (bVar50 == 0);
    auVar122 = auVar134._32_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }